

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

size_t ZSTD_compressBlock_btultra2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  ZSTD_optimal_t *pZVar3;
  ZSTD_match_t *pZVar4;
  ZSTD_optimal_t *pZVar5;
  undefined8 uVar6;
  optState_t *poVar7;
  U32 i;
  uint uVar8;
  U32 UVar9;
  U32 UVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  U32 UVar14;
  U32 UVar15;
  U32 UVar16;
  int iVar17;
  size_t sVar18;
  uint *puVar19;
  U32 *pUVar20;
  long lVar21;
  ZSTD_optimal_t *pZVar22;
  uint *puVar23;
  uint *puVar24;
  uint *puVar25;
  uint *puVar26;
  uint *puVar27;
  uint *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  U32 *pUVar32;
  ulong uVar33;
  uint *puVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  int bonus;
  int bonus_00;
  int bonus_01;
  int bonus_02;
  BYTE *base_2;
  uint uVar38;
  uint uVar39;
  BYTE *pBVar40;
  uint uVar41;
  seqStore_t *ssPtr;
  uint uVar42;
  BYTE *base_1;
  ulong uVar43;
  uint *puVar44;
  BYTE *pBVar45;
  BYTE *base;
  bool bVar46;
  repcodes_t rVar47;
  U32 *local_1c0;
  U32 *local_1b8;
  ulong local_1b0;
  U32 *local_1a8;
  U32 *local_198;
  uint *local_190;
  uint *local_180;
  uint *local_178;
  uint *local_170;
  U32 *local_168;
  ulong local_160;
  uint *local_148;
  uint *local_140;
  U32 *local_138;
  U32 local_11c;
  uint *local_118;
  uint *local_110;
  uint *local_108;
  U32 *local_100;
  U32 *local_f8;
  undefined8 local_f0;
  U32 local_e8;
  uint *local_e0;
  uint *local_d8;
  uint *local_d0;
  ulong local_c8;
  optState_t *local_c0;
  uint *local_b8;
  ulong local_b0;
  U32 *local_a8;
  ulong local_a0;
  uint *local_98;
  U32 *local_90;
  U32 *local_88;
  U32 *local_80;
  ulong local_78;
  ZSTD_optimal_t *local_70;
  int local_64;
  undefined8 local_60;
  U32 local_58;
  long local_50;
  seqStore_t *local_48;
  ulong local_40;
  size_t local_38;
  
  pBVar45 = (ms->window).base;
  local_40 = 4;
  local_a8 = rep;
  local_48 = seqStore;
  if (((((ms->opt).litLengthSum == 0) && (seqStore->sequences == seqStore->sequencesStart)) &&
      (uVar38 = (ms->window).dictLimit, uVar38 == (ms->window).lowLimit)) &&
     ((0x400 < srcSize && (uVar8 = (int)src - (int)pBVar45, uVar38 == uVar8)))) {
    local_e8 = rep[2];
    local_f0 = *(ulong *)rep;
    local_c0 = &ms->opt;
    uVar38 = (ms->cParams).targetLength;
    if (0xffe < uVar38) {
      uVar38 = 0xfff;
    }
    local_a0 = CONCAT44(local_a0._4_4_,uVar38);
    pBVar2 = (BYTE *)((long)src + srcSize);
    uVar38 = (ms->cParams).minMatch;
    local_d0 = (uint *)((long)src + (srcSize - 8));
    pZVar4 = (ms->opt).matchTable;
    pZVar5 = (ms->opt).priceTable;
    ms->nextToUpdate3 = ms->nextToUpdate;
    uVar38 = (uint)(uVar38 == 3);
    local_b0 = (ulong)(4 - uVar38);
    local_38 = srcSize;
    ZSTD_rescaleFreqs(local_c0,(BYTE *)src,srcSize,2);
    puVar44 = (uint *)((ulong)(pBVar45 + uVar8 == (BYTE *)src) + (long)src);
    local_d8 = (uint *)(ulong)(uVar38 ^ 3);
    local_70 = pZVar5 + 1;
    local_90 = pZVar5->rep;
    local_b8 = (uint *)src;
    ssPtr = local_48;
    local_148 = (uint *)src;
LAB_003c9081:
    src = local_b8;
    if (puVar44 < local_d0) {
      pBVar45 = (ms->window).base;
      uVar29 = (ulong)ms->nextToUpdate;
      if (pBVar45 + uVar29 <= puVar44) {
        iVar11 = (int)puVar44;
        UVar9 = iVar11 - (int)local_148;
        UVar14 = (ms->cParams).minMatch;
        uVar38 = iVar11 - (int)pBVar45;
        for (; (uint)uVar29 < uVar38; uVar29 = (ulong)((uint)uVar29 + UVar10)) {
          UVar10 = ZSTD_insertBt1(ms,pBVar45 + uVar29,pBVar2,UVar14,0);
        }
        ms->nextToUpdate = uVar38;
        if (1 < UVar14 - 6) {
          if (UVar14 == 5) {
            uVar29 = (ulong)(UVar9 == 0);
            uVar38 = (ms->cParams).targetLength;
            if (0xffe < uVar38) {
              uVar38 = 0xfff;
            }
            pBVar45 = (ms->window).base;
            uVar41 = iVar11 - (int)pBVar45;
            local_110 = (uint *)(ulong)uVar41;
            uVar43 = 0;
            local_100 = (U32 *)((ulong)(*(long *)puVar44 * -0x30e4432345000000) >>
                               (-(char)(ms->cParams).hashLog & 0x3fU));
            pUVar32 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar35 = uVar41 - uVar8;
            if (uVar41 < uVar8) {
              uVar35 = 0;
            }
            UVar14 = (ms->window).lowLimit;
            uVar37 = (ulong)((uVar8 & uVar41) * 2);
            local_1a8 = pUVar32 + uVar37;
            local_1c0 = pUVar32 + uVar37 + 1;
            iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            UVar10 = (ms->window).dictLimit;
            uVar39 = (U32)local_f0 - 1;
            local_f8 = ms->hashTable;
            UVar15 = local_f8[(long)local_100];
            uVar37 = uVar29 + 3;
            local_118 = puVar44 + 1;
            puVar23 = local_d8;
            for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
              uVar36 = uVar39;
              if (uVar29 != 3) {
                uVar36 = *(uint *)((long)&local_f0 + uVar29 * 4);
              }
              uVar42 = 0;
              if ((uVar36 - 1 < uVar41 - UVar10) &&
                 (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar36))) {
                sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar36),
                                    pBVar2);
                uVar42 = (int)sVar18 + 4;
              }
              puVar19 = (uint *)(ulong)uVar42;
              if (puVar23 < puVar19) {
                pZVar4[uVar43].off = (int)uVar29 - (uint)(UVar9 == 0);
                pZVar4[uVar43].len = uVar42;
                uVar43 = (ulong)((int)uVar43 + 1);
                if ((uVar38 < uVar42) ||
                   (puVar23 = puVar19, (BYTE *)((long)puVar44 + (long)puVar19) == pBVar2))
                goto LAB_003ca027;
              }
            }
            local_f8[(long)local_100] = (U32)local_110;
            local_110 = (uint *)(ulong)((U32)local_110 + 2);
            puVar19 = (uint *)0x0;
            puVar34 = (uint *)0x0;
            iVar13 = uVar41 + 9;
            while ((bVar46 = iVar11 != 0, iVar11 = iVar11 + -1, iVar12 = iVar13, bVar46 &&
                   (UVar14 + (UVar14 == 0) <= UVar15))) {
              puVar24 = puVar34;
              if (puVar19 < puVar34) {
                puVar24 = puVar19;
              }
              pBVar40 = pBVar45 + UVar15;
              sVar18 = ZSTD_count((BYTE *)((long)puVar44 + (long)puVar24),
                                  (BYTE *)((long)puVar24 + (long)pBVar40),pBVar2);
              puVar24 = (uint *)(sVar18 + (long)puVar24);
              if (puVar23 < puVar24) {
                iVar12 = UVar15 + (U32)puVar24;
                if (puVar24 <= (uint *)(ulong)(iVar13 - UVar15)) {
                  iVar12 = iVar13;
                }
                pZVar4[uVar43].off = (int)local_110 - UVar15;
                pZVar4[uVar43].len = (U32)puVar24;
                uVar43 = (ulong)((int)uVar43 + 1);
                if (((uint *)0x1000 < puVar24) ||
                   (puVar23 = puVar24, (BYTE *)((long)puVar44 + (long)puVar24) == pBVar2)) break;
              }
              pUVar20 = pUVar32 + (UVar15 & uVar8) * 2;
              if (pBVar40[(long)puVar24] < *(byte *)((long)puVar44 + (long)puVar24)) {
                *local_1a8 = UVar15;
                if (UVar15 <= uVar35) goto LAB_003c9e5b;
                pUVar20 = pUVar20 + 1;
                puVar19 = puVar24;
                puVar24 = puVar34;
                local_1a8 = pUVar20;
              }
              else {
                *local_1c0 = UVar15;
                local_1c0 = pUVar20;
                if (UVar15 <= uVar35) goto LAB_003c9fdd;
              }
              puVar34 = puVar24;
              iVar13 = iVar12;
              UVar15 = *pUVar20;
            }
            goto LAB_003ca016;
          }
          if (UVar14 != 3) {
            uVar29 = (ulong)(UVar9 == 0);
            uVar38 = (ms->cParams).targetLength;
            if (0xffe < uVar38) {
              uVar38 = 0xfff;
            }
            pBVar45 = (ms->window).base;
            uVar41 = iVar11 - (int)pBVar45;
            local_110 = (uint *)(ulong)uVar41;
            uVar43 = 0;
            local_100 = (U32 *)(ulong)(*puVar44 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
            pUVar32 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            uVar35 = uVar41 - uVar8;
            if (uVar41 < uVar8) {
              uVar35 = 0;
            }
            UVar14 = (ms->window).lowLimit;
            uVar37 = (ulong)((uVar8 & uVar41) * 2);
            local_1a8 = pUVar32 + uVar37;
            local_1c0 = pUVar32 + uVar37 + 1;
            iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            UVar10 = (ms->window).dictLimit;
            uVar39 = (U32)local_f0 - 1;
            local_f8 = ms->hashTable;
            UVar15 = local_f8[(long)local_100];
            uVar37 = uVar29 + 3;
            local_118 = puVar44 + 1;
            puVar23 = local_d8;
            for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
              uVar36 = uVar39;
              if (uVar29 != 3) {
                uVar36 = *(uint *)((long)&local_f0 + uVar29 * 4);
              }
              uVar42 = 0;
              if ((uVar36 - 1 < uVar41 - UVar10) &&
                 (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar36))) {
                sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar36),
                                    pBVar2);
                uVar42 = (int)sVar18 + 4;
              }
              puVar19 = (uint *)(ulong)uVar42;
              if (puVar23 < puVar19) {
                pZVar4[uVar43].off = (int)uVar29 - (uint)(UVar9 == 0);
                pZVar4[uVar43].len = uVar42;
                uVar43 = (ulong)((int)uVar43 + 1);
                if ((uVar38 < uVar42) ||
                   (puVar23 = puVar19, (BYTE *)((long)puVar44 + (long)puVar19) == pBVar2))
                goto LAB_003ca027;
              }
            }
            local_f8[(long)local_100] = (U32)local_110;
            local_110 = (uint *)(ulong)((U32)local_110 + 2);
            puVar19 = (uint *)0x0;
            puVar34 = (uint *)0x0;
            iVar13 = uVar41 + 9;
            while ((bVar46 = iVar11 != 0, iVar11 = iVar11 + -1, iVar12 = iVar13, bVar46 &&
                   (UVar14 + (UVar14 == 0) <= UVar15))) {
              puVar24 = puVar34;
              if (puVar19 < puVar34) {
                puVar24 = puVar19;
              }
              pBVar40 = pBVar45 + UVar15;
              sVar18 = ZSTD_count((BYTE *)((long)puVar44 + (long)puVar24),
                                  (BYTE *)((long)puVar24 + (long)pBVar40),pBVar2);
              puVar24 = (uint *)(sVar18 + (long)puVar24);
              if (puVar23 < puVar24) {
                iVar12 = UVar15 + (U32)puVar24;
                if (puVar24 <= (uint *)(ulong)(iVar13 - UVar15)) {
                  iVar12 = iVar13;
                }
                pZVar4[uVar43].off = (int)local_110 - UVar15;
                pZVar4[uVar43].len = (U32)puVar24;
                uVar43 = (ulong)((int)uVar43 + 1);
                if (((uint *)0x1000 < puVar24) ||
                   (puVar23 = puVar24, (BYTE *)((long)puVar44 + (long)puVar24) == pBVar2)) break;
              }
              pUVar20 = pUVar32 + (UVar15 & uVar8) * 2;
              if (pBVar40[(long)puVar24] < *(byte *)((long)puVar44 + (long)puVar24)) {
                *local_1a8 = UVar15;
                if (UVar15 <= uVar35) goto LAB_003c9e5b;
                pUVar20 = pUVar20 + 1;
                puVar19 = puVar24;
                puVar24 = puVar34;
                local_1a8 = pUVar20;
              }
              else {
                *local_1c0 = UVar15;
                local_1c0 = pUVar20;
                if (UVar15 <= uVar35) goto LAB_003c9fdd;
              }
              puVar34 = puVar24;
              iVar13 = iVar12;
              UVar15 = *pUVar20;
            }
            goto LAB_003ca016;
          }
          uVar29 = (ulong)(UVar9 == 0);
          uVar38 = (ms->cParams).targetLength;
          if (0xffe < uVar38) {
            uVar38 = 0xfff;
          }
          pBVar45 = (ms->window).base;
          uVar41 = iVar11 - (int)pBVar45;
          uVar43 = 0;
          local_100 = (U32 *)(ulong)(*puVar44 * -0x61c8864f >>
                                    (-(char)(ms->cParams).hashLog & 0x1fU));
          pUVar32 = ms->chainTable;
          uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          uVar35 = uVar41 - uVar8;
          if (uVar41 < uVar8) {
            uVar35 = 0;
          }
          UVar14 = (ms->window).lowLimit;
          uVar36 = UVar14 + (UVar14 == 0);
          uVar37 = (ulong)((uVar8 & uVar41) * 2);
          local_1a8 = pUVar32 + uVar37;
          local_168 = pUVar32 + uVar37 + 1;
          iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          UVar14 = (ms->window).dictLimit;
          uVar39 = (U32)local_f0 - 1;
          local_f8 = ms->hashTable;
          UVar10 = local_f8[(long)local_100];
          iVar12 = uVar41 + 9;
          uVar37 = uVar29 + 3;
          local_118 = (uint *)((long)puVar44 + 3);
          local_110 = (uint *)CONCAT44(local_110._4_4_,uVar39);
          puVar23 = local_d8;
          for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
            uVar42 = uVar39;
            if (uVar29 != 3) {
              uVar42 = *(uint *)((long)&local_f0 + uVar29 * 4);
            }
            puVar19 = (uint *)0x0;
            if ((uVar42 - 1 < uVar41 - UVar14) &&
               (((*(uint *)((long)puVar44 - (ulong)uVar42) ^ *puVar44) & 0xffffff) == 0)) {
              sVar18 = ZSTD_count((BYTE *)local_118,(BYTE *)((long)local_118 - (ulong)uVar42),pBVar2
                                 );
              puVar19 = (uint *)(ulong)((int)sVar18 + 3);
              uVar39 = (uint)local_110;
            }
            if (puVar23 < puVar19) {
              pZVar4[uVar43].off = (int)uVar29 - (uint)(UVar9 == 0);
              pZVar4[uVar43].len = (uint)puVar19;
              uVar43 = (ulong)((int)uVar43 + 1);
              if ((uVar38 < (uint)puVar19) ||
                 (puVar23 = puVar19, (BYTE *)((long)puVar44 + (long)puVar19) == pBVar2))
              goto LAB_003ca027;
            }
          }
          if (((((uint *)0x2 < puVar23) ||
               (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar44), UVar14 < uVar36)) ||
              (0x3ffff < uVar41 - UVar14)) ||
             (puVar19 = (uint *)ZSTD_count((BYTE *)puVar44,pBVar45 + UVar14,pBVar2),
             puVar19 < (uint *)0x3)) {
LAB_003c9e77:
            local_f8[(long)local_100] = uVar41;
            puVar19 = (uint *)0x0;
            puVar34 = (uint *)0x0;
            do {
              bVar46 = iVar11 == 0;
              iVar11 = iVar11 + -1;
              local_1c0 = local_168;
              if ((bVar46) || (UVar10 < uVar36)) goto LAB_003ca016;
              puVar24 = puVar34;
              if (puVar19 < puVar34) {
                puVar24 = puVar19;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar44 + (long)puVar24),
                                  (BYTE *)((long)puVar24 + (long)(pBVar45 + UVar10)),pBVar2);
              puVar24 = (uint *)(sVar18 + (long)puVar24);
              if (puVar23 < puVar24) {
                iVar13 = UVar10 + (U32)puVar24;
                if (puVar24 <= (uint *)(ulong)(iVar12 - UVar10)) {
                  iVar13 = iVar12;
                }
                iVar12 = iVar13;
                pZVar4[uVar43].off = (uVar41 + 2) - UVar10;
                pZVar4[uVar43].len = (U32)puVar24;
                uVar43 = (ulong)((int)uVar43 + 1);
                if (((uint *)0x1000 < puVar24) ||
                   (puVar23 = puVar24, (BYTE *)((long)puVar44 + (long)puVar24) == pBVar2))
                goto LAB_003ca016;
              }
              pUVar20 = pUVar32 + (UVar10 & uVar8) * 2;
              if ((pBVar45 + UVar10)[(long)puVar24] < *(byte *)((long)puVar44 + (long)puVar24)) {
                *local_1a8 = UVar10;
                if (UVar10 <= uVar35) {
                  local_1a8 = &local_11c;
                  goto LAB_003ca016;
                }
                pUVar20 = pUVar20 + 1;
                puVar19 = puVar24;
                puVar24 = puVar34;
                local_1a8 = pUVar20;
              }
              else {
                *local_168 = UVar10;
                local_168 = pUVar20;
                if (UVar10 <= uVar35) goto LAB_003c9fdd;
              }
              UVar10 = *pUVar20;
              puVar34 = puVar24;
            } while( true );
          }
          pZVar4->off = (uVar41 - UVar14) + 2;
          pZVar4->len = (U32)puVar19;
          uVar43 = 1;
          puVar23 = puVar19;
          if (puVar19 <= (uint *)(ulong)uVar38 && (BYTE *)((long)puVar19 + (long)puVar44) != pBVar2)
          goto LAB_003c9e77;
          UVar14 = uVar41 + 1;
          uVar43 = 1;
          goto LAB_003ca01f;
        }
        uVar29 = (ulong)(UVar9 == 0);
        uVar38 = (ms->cParams).targetLength;
        if (0xffe < uVar38) {
          uVar38 = 0xfff;
        }
        pBVar45 = (ms->window).base;
        uVar41 = iVar11 - (int)pBVar45;
        uVar43 = 0;
        local_118 = (uint *)((ulong)(*(long *)puVar44 * -0x30e4432340650000) >>
                            (-(char)(ms->cParams).hashLog & 0x3fU));
        pUVar32 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar35 = uVar41 - uVar8;
        if (uVar41 < uVar8) {
          uVar35 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar37 = (ulong)((uVar8 & uVar41) * 2);
        local_198 = pUVar32 + uVar37;
        local_168 = pUVar32 + uVar37 + 1;
        iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        UVar10 = (ms->window).dictLimit;
        uVar39 = (U32)local_f0 - 1;
        local_100 = ms->hashTable;
        UVar15 = local_100[(long)local_118];
        iVar13 = uVar41 + 9;
        uVar37 = uVar29 + 3;
        local_110 = (uint *)CONCAT44(local_110._4_4_,uVar39);
        puVar23 = local_d8;
        for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
          uVar36 = uVar39;
          if (uVar29 != 3) {
            uVar36 = *(uint *)((long)&local_f0 + uVar29 * 4);
          }
          puVar19 = (uint *)0x0;
          if ((uVar36 - 1 < uVar41 - UVar10) &&
             (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar36))) {
            sVar18 = ZSTD_count((BYTE *)(puVar44 + 1),(BYTE *)((long)(puVar44 + 1) - (ulong)uVar36),
                                pBVar2);
            puVar19 = (uint *)(ulong)((int)sVar18 + 4);
            uVar39 = (uint)local_110;
          }
          if (puVar23 < puVar19) {
            pZVar4[uVar43].off = (int)uVar29 - (uint)(UVar9 == 0);
            pZVar4[uVar43].len = (uint)puVar19;
            uVar43 = (ulong)((int)uVar43 + 1);
            if ((uVar38 < (uint)puVar19) ||
               (puVar23 = puVar19, (BYTE *)((long)puVar44 + (long)puVar19) == pBVar2))
            goto LAB_003ca027;
          }
        }
        local_100[(long)local_118] = uVar41;
        puVar19 = (uint *)0x0;
        puVar34 = (uint *)0x0;
LAB_003c9543:
        bVar46 = iVar11 == 0;
        iVar11 = iVar11 + -1;
        if ((bVar46) || (UVar15 < UVar14 + (UVar14 == 0))) goto LAB_003c9e45;
        puVar24 = puVar19;
        if (puVar34 < puVar19) {
          puVar24 = puVar34;
        }
        pBVar40 = pBVar45 + UVar15;
        sVar18 = ZSTD_count((BYTE *)((long)puVar44 + (long)puVar24),pBVar40 + (long)puVar24,pBVar2);
        puVar24 = (uint *)(sVar18 + (long)puVar24);
        if (puVar23 < puVar24) {
          iVar12 = UVar15 + (U32)puVar24;
          if (puVar24 <= (uint *)(ulong)(iVar13 - UVar15)) {
            iVar12 = iVar13;
          }
          pZVar4[uVar43].off = (uVar41 + 2) - UVar15;
          pZVar4[uVar43].len = (U32)puVar24;
          uVar43 = (ulong)((int)uVar43 + 1);
          iVar13 = iVar12;
          if (((uint *)0x1000 < puVar24) ||
             (puVar23 = puVar24, (BYTE *)((long)puVar44 + (long)puVar24) == pBVar2))
          goto LAB_003c9e45;
        }
        pUVar20 = pUVar32 + (UVar15 & uVar8) * 2;
        if (*(byte *)((long)puVar44 + (long)puVar24) <= pBVar40[(long)puVar24]) {
          *local_168 = UVar15;
          local_168 = pUVar20;
          puVar19 = puVar24;
          if (UVar15 <= uVar35) {
            local_168 = &local_11c;
            goto LAB_003c9e45;
          }
LAB_003c9674:
          UVar15 = *pUVar20;
          goto LAB_003c9543;
        }
        *local_198 = UVar15;
        if (uVar35 < UVar15) {
          pUVar20 = pUVar20 + 1;
          puVar34 = puVar24;
          local_198 = pUVar20;
          goto LAB_003c9674;
        }
        local_198 = &local_11c;
LAB_003c9e45:
        *local_168 = 0;
        *local_198 = 0;
        ms->nextToUpdate = iVar13 - 8;
        goto LAB_003ca027;
      }
      goto LAB_003ca041;
    }
    ZSTD_resetSeqStore(ssPtr);
    srcSize = local_38;
    ppBVar1 = &(ms->window).base;
    *ppBVar1 = *ppBVar1 + -local_38;
    UVar14 = (ms->window).dictLimit + (int)local_38;
    (ms->window).dictLimit = UVar14;
    (ms->window).lowLimit = UVar14;
    ms->nextToUpdate = UVar14;
    ms->nextToUpdate3 = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).litFreq,0xff,bonus);
    (ms->opt).litSum = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).litLengthFreq,0x23,bonus_00);
    (ms->opt).litLengthSum = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).matchLengthFreq,0x34,bonus_01);
    (ms->opt).matchLengthSum = UVar14;
    UVar14 = ZSTD_upscaleStat((ms->opt).offCodeFreq,0x1f,bonus_02);
    (ms->opt).offCodeSum = UVar14;
    pBVar45 = (ms->window).base;
  }
  uVar38 = (ms->window).dictLimit;
  uVar8 = (ms->cParams).targetLength;
  if (0xffe < uVar8) {
    uVar8 = 0xfff;
  }
  local_50 = CONCAT44(local_50._4_4_,uVar8);
  local_c0 = &ms->opt;
  uVar8 = (ms->cParams).minMatch;
  pBVar2 = (BYTE *)((long)src + srcSize);
  pZVar5 = (ms->opt).priceTable;
  pZVar4 = (ms->opt).matchTable;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_110 = (uint *)((long)src + (srcSize - 8));
  uVar8 = (uint)(uVar8 == 3);
  local_40 = (ulong)((int)local_40 - uVar8);
  ZSTD_rescaleFreqs(local_c0,(BYTE *)src,srcSize,2);
  puVar44 = (uint *)((ulong)(pBVar45 + uVar38 == (BYTE *)src) + (long)src);
  local_b0 = (ulong)(uVar8 ^ 3);
  local_70 = pZVar5 + 1;
  local_88 = pZVar5->rep;
  local_b8 = (uint *)src;
LAB_003cba83:
  if (local_110 <= puVar44) {
    return (long)pBVar2 - (long)src;
  }
  pBVar45 = (ms->window).base;
  uVar29 = (ulong)ms->nextToUpdate;
  if (pBVar45 + uVar29 <= puVar44) {
    iVar11 = (int)puVar44;
    local_160._0_4_ = iVar11 - (int)src;
    UVar14 = (ms->cParams).minMatch;
    uVar38 = iVar11 - (int)pBVar45;
    for (; pUVar32 = local_a8, (uint)uVar29 < uVar38; uVar29 = (ulong)((uint)uVar29 + UVar9)) {
      UVar9 = ZSTD_insertBt1(ms,pBVar45 + uVar29,pBVar2,UVar14,0);
    }
    ms->nextToUpdate = uVar38;
    if (1 < UVar14 - 6) {
      if (UVar14 == 5) {
        uVar29 = (ulong)((U32)local_160 == 0);
        uVar38 = (ms->cParams).targetLength;
        if (0xffe < uVar38) {
          uVar38 = 0xfff;
        }
        pBVar45 = (ms->window).base;
        uVar41 = iVar11 - (int)pBVar45;
        local_118 = (uint *)((ulong)(*(long *)puVar44 * -0x30e4432345000000) >>
                            (-(char)(ms->cParams).hashLog & 0x3fU));
        uVar43 = 0;
        pUVar20 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar35 = uVar41 - uVar8;
        if (uVar41 < uVar8) {
          uVar35 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar37 = (ulong)((uVar8 & uVar41) * 2);
        local_198 = pUVar20 + uVar37;
        local_1b8 = pUVar20 + uVar37 + 1;
        UVar9 = (ms->window).dictLimit;
        iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        local_d8 = ms->hashTable;
        uVar39 = local_d8[(long)local_118];
        iVar11 = uVar41 + 9;
        uVar37 = uVar29 + 3;
        local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar38);
        uVar31 = local_b0;
        for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
          if (uVar29 == 3) {
            uVar36 = *pUVar32 - 1;
          }
          else {
            uVar36 = pUVar32[uVar29];
          }
          uVar33 = 0;
          if ((uVar36 - 1 < uVar41 - UVar9) &&
             (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar36))) {
            sVar18 = ZSTD_count((BYTE *)(puVar44 + 1),(BYTE *)((long)(puVar44 + 1) - (ulong)uVar36),
                                pBVar2);
            uVar33 = (ulong)((int)sVar18 + 4);
            uVar38 = (uint)local_d0;
          }
          if (uVar31 < uVar33) {
            pZVar4[uVar43].off = (int)uVar29 - (uint)((U32)local_160 == 0);
            pZVar4[uVar43].len = (uint)uVar33;
            uVar43 = (ulong)((int)uVar43 + 1);
            if ((uVar38 < (uint)uVar33) ||
               (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2)) goto LAB_003cca16;
          }
        }
        local_d8[(long)local_118] = uVar41;
        uVar29 = 0;
        uVar37 = 0;
        while ((bVar46 = iVar13 != 0, iVar13 = iVar13 + -1, local_138 = local_198, bVar46 &&
               (UVar14 + (UVar14 == 0) <= uVar39))) {
          uVar33 = uVar37;
          if (uVar29 < uVar37) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar44 + uVar33),pBVar45 + uVar33 + uVar39,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar39 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar39) {
              iVar12 = iVar11;
            }
            pZVar4[uVar43].off = (uVar41 + 2) - uVar39;
            pZVar4[uVar43].len = (U32)uVar33;
            uVar43 = (ulong)((int)uVar43 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2))
            break;
          }
          pUVar32 = pUVar20 + (uVar39 & uVar8) * 2;
          if (pBVar45[uVar33 + uVar39] < *(byte *)((long)puVar44 + uVar33)) {
            *local_198 = uVar39;
            if (uVar39 <= uVar35) goto LAB_003cc9cf;
            pUVar32 = pUVar32 + 1;
            uVar29 = uVar33;
            uVar33 = uVar37;
            local_198 = pUVar32;
          }
          else {
            *local_1b8 = uVar39;
            local_1b8 = pUVar32;
            if (uVar39 <= uVar35) goto LAB_003cc845;
          }
          uVar37 = uVar33;
          uVar39 = *pUVar32;
        }
        goto LAB_003cca05;
      }
      if (UVar14 != 3) {
        uVar29 = (ulong)((U32)local_160 == 0);
        uVar38 = (ms->cParams).targetLength;
        if (0xffe < uVar38) {
          uVar38 = 0xfff;
        }
        pBVar45 = (ms->window).base;
        uVar41 = iVar11 - (int)pBVar45;
        local_118 = (uint *)(ulong)(*puVar44 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU)
                                   );
        uVar43 = 0;
        pUVar20 = ms->chainTable;
        uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
        uVar35 = uVar41 - uVar8;
        if (uVar41 < uVar8) {
          uVar35 = 0;
        }
        UVar14 = (ms->window).lowLimit;
        uVar37 = (ulong)((uVar8 & uVar41) * 2);
        local_198 = pUVar20 + uVar37;
        local_1b8 = pUVar20 + uVar37 + 1;
        uVar36 = uVar41 - (ms->window).dictLimit;
        iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        local_d8 = ms->hashTable;
        uVar39 = local_d8[(long)local_118];
        iVar11 = uVar41 + 9;
        uVar37 = uVar29 + 3;
        local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar36);
        uVar31 = local_b0;
        for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
          if (uVar29 == 3) {
            uVar42 = *pUVar32 - 1;
          }
          else {
            uVar42 = pUVar32[uVar29];
          }
          uVar33 = 0;
          if ((uVar42 - 1 < uVar36) && (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar42))) {
            sVar18 = ZSTD_count((BYTE *)(puVar44 + 1),(BYTE *)((long)(puVar44 + 1) - (ulong)uVar42),
                                pBVar2);
            uVar33 = (ulong)((int)sVar18 + 4);
            uVar36 = (uint)local_d0;
          }
          if (uVar31 < uVar33) {
            pZVar4[uVar43].off = (int)uVar29 - (uint)((U32)local_160 == 0);
            pZVar4[uVar43].len = (uint)uVar33;
            uVar43 = (ulong)((int)uVar43 + 1);
            if ((uVar38 < (uint)uVar33) ||
               (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2)) goto LAB_003cca16;
          }
        }
        local_d8[(long)local_118] = uVar41;
        uVar29 = 0;
        uVar37 = 0;
        while ((bVar46 = iVar13 != 0, iVar13 = iVar13 + -1, local_138 = local_198, bVar46 &&
               (UVar14 + (UVar14 == 0) <= uVar39))) {
          uVar33 = uVar37;
          if (uVar29 < uVar37) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar44 + uVar33),pBVar45 + uVar33 + uVar39,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar39 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar39) {
              iVar12 = iVar11;
            }
            pZVar4[uVar43].off = (uVar41 + 2) - uVar39;
            pZVar4[uVar43].len = (U32)uVar33;
            uVar43 = (ulong)((int)uVar43 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2))
            break;
          }
          pUVar32 = pUVar20 + (uVar39 & uVar8) * 2;
          if (pBVar45[uVar33 + uVar39] < *(byte *)((long)puVar44 + uVar33)) {
            *local_198 = uVar39;
            if (uVar39 <= uVar35) goto LAB_003cc9cf;
            pUVar32 = pUVar32 + 1;
            uVar29 = uVar33;
            uVar33 = uVar37;
            local_198 = pUVar32;
          }
          else {
            *local_1b8 = uVar39;
            local_1b8 = pUVar32;
            if (uVar39 <= uVar35) goto LAB_003cc845;
          }
          uVar37 = uVar33;
          uVar39 = *pUVar32;
        }
        goto LAB_003cca05;
      }
      uVar29 = (ulong)((U32)local_160 == 0);
      uVar38 = (ms->cParams).targetLength;
      if (0xffe < uVar38) {
        uVar38 = 0xfff;
      }
      pBVar45 = (ms->window).base;
      uVar41 = iVar11 - (int)pBVar45;
      local_d0 = (uint *)(ulong)(*puVar44 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
      uVar43 = 0;
      pUVar32 = ms->chainTable;
      uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar35 = uVar41 - uVar8;
      if (uVar41 < uVar8) {
        uVar35 = 0;
      }
      UVar14 = (ms->window).lowLimit;
      uVar36 = UVar14 + (UVar14 == 0);
      uVar37 = (ulong)((uVar8 & uVar41) * 2);
      local_138 = pUVar32 + uVar37;
      local_1b8 = pUVar32 + uVar37 + 1;
      UVar14 = (ms->window).dictLimit;
      iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      local_118 = ms->hashTable;
      uVar39 = local_118[(long)local_d0];
      iVar11 = uVar41 + 9;
      uVar37 = uVar29 + 3;
      uVar31 = local_b0;
      for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
        if (uVar29 == 3) {
          uVar42 = *local_a8 - 1;
        }
        else {
          uVar42 = local_a8[uVar29];
        }
        uVar33 = 0;
        if ((uVar42 - 1 < uVar41 - UVar14) &&
           (((*(uint *)((long)puVar44 - (ulong)uVar42) ^ *puVar44) & 0xffffff) == 0)) {
          sVar18 = ZSTD_count((BYTE *)((long)puVar44 + 3),
                              (BYTE *)((long)puVar44 + 3) + -(ulong)uVar42,pBVar2);
          uVar33 = (ulong)((int)sVar18 + 3);
        }
        if (uVar31 < uVar33) {
          pZVar4[uVar43].off = (int)uVar29 - (uint)((U32)local_160 == 0);
          pZVar4[uVar43].len = (uint)uVar33;
          uVar43 = (ulong)((int)uVar43 + 1);
          if ((uVar38 < (uint)uVar33) ||
             (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2)) goto LAB_003cca16;
        }
      }
      if ((((2 < uVar31) ||
           (UVar14 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar44), UVar14 < uVar36)) ||
          (0x3ffff < uVar41 - UVar14)) ||
         (sVar18 = ZSTD_count((BYTE *)puVar44,pBVar45 + UVar14,pBVar2), sVar18 < 3)) {
LAB_003cc865:
        local_118[(long)local_d0] = uVar41;
        uVar29 = 0;
        uVar37 = 0;
        do {
          bVar46 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          if ((bVar46) || (uVar39 < uVar36)) goto LAB_003cca05;
          uVar33 = uVar37;
          if (uVar29 < uVar37) {
            uVar33 = uVar29;
          }
          sVar18 = ZSTD_count((BYTE *)((long)puVar44 + uVar33),pBVar45 + uVar33 + uVar39,pBVar2);
          uVar33 = sVar18 + uVar33;
          if (uVar31 < uVar33) {
            iVar12 = uVar39 + (U32)uVar33;
            if (uVar33 <= iVar11 - uVar39) {
              iVar12 = iVar11;
            }
            pZVar4[uVar43].off = (uVar41 + 2) - uVar39;
            pZVar4[uVar43].len = (U32)uVar33;
            uVar43 = (ulong)((int)uVar43 + 1);
            iVar11 = iVar12;
            if ((0x1000 < uVar33) || (uVar31 = uVar33, (BYTE *)((long)puVar44 + uVar33) == pBVar2))
            goto LAB_003cca05;
          }
          pUVar20 = pUVar32 + (uVar39 & uVar8) * 2;
          if (pBVar45[uVar33 + uVar39] < *(byte *)((long)puVar44 + uVar33)) {
            *local_138 = uVar39;
            if (uVar39 <= uVar35) goto LAB_003cc9cf;
            pUVar20 = pUVar20 + 1;
            uVar29 = uVar33;
            uVar33 = uVar37;
            local_138 = pUVar20;
          }
          else {
            *local_1b8 = uVar39;
            local_1b8 = pUVar20;
            if (uVar39 <= uVar35) {
              local_1b8 = (U32 *)&local_f0;
              goto LAB_003cca05;
            }
          }
          uVar39 = *pUVar20;
          uVar37 = uVar33;
        } while( true );
      }
      pZVar4->off = (uVar41 - UVar14) + 2;
      pZVar4->len = (U32)sVar18;
      uVar43 = 1;
      uVar31 = sVar18;
      if (sVar18 <= uVar38 && (BYTE *)(sVar18 + (long)puVar44) != pBVar2) goto LAB_003cc865;
      UVar14 = uVar41 + 1;
      uVar43 = 1;
      goto LAB_003cca0e;
    }
    uVar29 = (ulong)((U32)local_160 == 0);
    uVar38 = (ms->cParams).targetLength;
    if (0xffe < uVar38) {
      uVar38 = 0xfff;
    }
    pBVar45 = (ms->window).base;
    uVar41 = iVar11 - (int)pBVar45;
    uVar37 = (ulong)(*(long *)puVar44 * -0x30e4432340650000) >>
             (-(char)(ms->cParams).hashLog & 0x3fU);
    uVar43 = 0;
    pUVar32 = ms->chainTable;
    uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar35 = uVar41 - uVar8;
    if (uVar41 < uVar8) {
      uVar35 = 0;
    }
    UVar14 = (ms->window).lowLimit;
    uVar31 = (ulong)((uVar8 & uVar41) * 2);
    local_198 = pUVar32 + uVar31;
    local_1b8 = pUVar32 + uVar31 + 1;
    UVar9 = (ms->window).dictLimit;
    iVar11 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    local_d0 = ms->hashTable;
    uVar39 = local_d0[uVar37];
    iVar13 = uVar41 + 9;
    uVar31 = uVar29 + 3;
    uVar33 = local_b0;
    for (; uVar29 < uVar31; uVar29 = uVar29 + 1) {
      if (uVar29 == 3) {
        uVar36 = *local_a8 - 1;
      }
      else {
        uVar36 = local_a8[uVar29];
      }
      uVar30 = 0;
      if ((uVar36 - 1 < uVar41 - UVar9) && (*puVar44 == *(uint *)((long)puVar44 - (ulong)uVar36))) {
        sVar18 = ZSTD_count((BYTE *)(puVar44 + 1),(BYTE *)((long)(puVar44 + 1) - (ulong)uVar36),
                            pBVar2);
        uVar30 = (ulong)((int)sVar18 + 4);
      }
      if (uVar33 < uVar30) {
        pZVar4[uVar43].off = (int)uVar29 - (uint)((U32)local_160 == 0);
        pZVar4[uVar43].len = (uint)uVar30;
        uVar43 = (ulong)((int)uVar43 + 1);
        if ((uVar38 < (uint)uVar30) || (uVar33 = uVar30, (BYTE *)((long)puVar44 + uVar30) == pBVar2)
           ) goto LAB_003cca16;
      }
    }
    local_d0[uVar37] = uVar41;
    uVar29 = 0;
    uVar37 = 0;
LAB_003cbf0b:
    bVar46 = iVar11 == 0;
    iVar11 = iVar11 + -1;
    if ((bVar46) || (uVar39 < UVar14 + (UVar14 == 0))) goto LAB_003cc827;
    uVar31 = uVar37;
    if (uVar29 < uVar37) {
      uVar31 = uVar29;
    }
    sVar18 = ZSTD_count((BYTE *)((long)puVar44 + uVar31),pBVar45 + uVar31 + uVar39,pBVar2);
    uVar31 = sVar18 + uVar31;
    if (uVar33 < uVar31) {
      iVar12 = uVar39 + (U32)uVar31;
      if (uVar31 <= iVar13 - uVar39) {
        iVar12 = iVar13;
      }
      pZVar4[uVar43].off = (uVar41 + 2) - uVar39;
      pZVar4[uVar43].len = (U32)uVar31;
      uVar43 = (ulong)((int)uVar43 + 1);
      iVar13 = iVar12;
      if ((0x1000 < uVar31) || (uVar33 = uVar31, (BYTE *)((long)puVar44 + uVar31) == pBVar2))
      goto LAB_003cc827;
    }
    pUVar20 = pUVar32 + (uVar39 & uVar8) * 2;
    if (*(byte *)((long)puVar44 + uVar31) <= pBVar45[uVar31 + uVar39]) {
      *local_1b8 = uVar39;
      local_1b8 = pUVar20;
      if (uVar39 <= uVar35) {
        local_1b8 = (U32 *)&local_f0;
        goto LAB_003cc827;
      }
LAB_003cc033:
      uVar39 = *pUVar20;
      uVar37 = uVar31;
      goto LAB_003cbf0b;
    }
    *local_198 = uVar39;
    if (uVar35 < uVar39) {
      pUVar20 = pUVar20 + 1;
      uVar29 = uVar31;
      uVar31 = uVar37;
      local_198 = pUVar20;
      goto LAB_003cc033;
    }
    local_198 = (U32 *)&local_f0;
LAB_003cc827:
    *local_1b8 = 0;
    *local_198 = 0;
    ms->nextToUpdate = iVar13 - 8;
    goto LAB_003cca16;
  }
  goto LAB_003cca28;
LAB_003c9e5b:
  local_1a8 = &local_11c;
  goto LAB_003ca016;
LAB_003c9fdd:
  local_1c0 = &local_11c;
LAB_003ca016:
  *local_1c0 = 0;
  *local_1a8 = 0;
  UVar14 = iVar12 - 8;
LAB_003ca01f:
  ms->nextToUpdate = UVar14;
LAB_003ca027:
  iVar11 = local_64;
  poVar7 = local_c0;
  ssPtr = local_48;
  if ((int)uVar43 == 0) {
LAB_003ca041:
    puVar44 = (uint *)((long)puVar44 + 1);
  }
  else {
    for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
      pZVar5->rep[lVar21] = *(U32 *)((long)&local_f0 + lVar21 * 4);
    }
    pZVar5->mlen = 0;
    pZVar5->litlen = UVar9;
    iVar13 = ZSTD_literalsContribution((BYTE *)local_148,UVar9,local_c0,2);
    pZVar5->price = iVar13;
    uVar8 = (int)uVar43 - 1;
    uVar38 = pZVar4[uVar8].len;
    if ((uint)local_a0 < uVar38) {
      UVar10 = pZVar4[uVar8].off;
      uVar29 = 0;
      local_64 = iVar11;
    }
    else {
      UVar14 = ZSTD_litLengthPrice(0,poVar7,2);
      pZVar22 = local_70;
      for (uVar29 = 1; uVar29 < local_b0; uVar29 = uVar29 + 1) {
        pZVar22->price = 0x40000000;
        pZVar22 = pZVar22 + 1;
      }
      uVar37 = 0;
      while( true ) {
        uVar31 = 1;
        if (uVar37 == uVar43) break;
        UVar10 = pZVar4[uVar37].off;
        uVar38 = pZVar4[uVar37].len;
        rVar47 = ZSTD_updateRep((U32 *)&local_f0,UVar10,(uint)(UVar9 == 0));
        uVar8 = 0x1f;
        if (UVar10 + 1 != 0) {
          for (; UVar10 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar35 = (int)uVar29 * 0x100 - 0x200;
        while (uVar41 = (uint)uVar29, uVar41 <= uVar38) {
          if ((ms->opt).priceType == zop_predef) {
            iVar11 = 0x1f;
            if (uVar41 - 2 != 0) {
              for (; uVar41 - 2 >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            iVar11 = (iVar11 + uVar8) * 0x100 + (uVar35 >> ((byte)iVar11 & 0x1f)) + 0x1000;
          }
          else {
            uVar36 = uVar41 - 3;
            uVar39 = (ms->opt).offCodeFreq[uVar8] + 1;
            iVar11 = 0x1f;
            if (uVar39 != 0) {
              for (; uVar39 >> iVar11 == 0; iVar11 = iVar11 + -1) {
              }
            }
            if (uVar36 < 0x80) {
              uVar36 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar36];
            }
            else {
              uVar42 = 0x1f;
              if (uVar36 != 0) {
                for (; uVar36 >> uVar42 == 0; uVar42 = uVar42 - 1) {
                }
              }
              uVar36 = (uVar42 ^ 0xffffffe0) + 0x44;
            }
            uVar42 = (ms->opt).matchLengthFreq[uVar36] + 1;
            iVar12 = 0x1f;
            if (uVar42 != 0) {
              for (; uVar42 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            iVar11 = (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar39 * 0x100 >> ((byte)iVar11 & 0x1f)) +
                     (uVar42 * 0x100 >> ((byte)iVar12 & 0x1f)))) +
                     ((ML_bits[uVar36] + uVar8) - (iVar11 + iVar12)) * 0x100 + 0x33;
          }
          uVar29 = uVar29 & 0xffffffff;
          pZVar5[uVar29].mlen = uVar41;
          pZVar5[uVar29].off = UVar10;
          pZVar5[uVar29].litlen = UVar9;
          pZVar5[uVar29].price = iVar11 + UVar14 + iVar13;
          *(long *)pZVar5[uVar29].rep = rVar47.rep._0_8_;
          pZVar5[uVar29].rep[2] = rVar47.rep[2];
          uVar35 = uVar35 + 0x100;
          uVar29 = (ulong)(uVar41 + 1);
        }
        uVar37 = uVar37 + 1;
      }
      uVar29 = (ulong)((int)uVar29 - 1);
LAB_003ca296:
      poVar7 = local_c0;
      uVar8 = (uint)uVar31;
      uVar35 = (uint)uVar29;
      if (uVar8 <= uVar35) {
        pZVar22 = pZVar5 + (uVar8 - 1);
        UVar14 = 1;
        if (pZVar5[uVar8 - 1].mlen == 0) {
          UVar14 = pZVar22->litlen + 1;
        }
        puVar23 = (uint *)((long)puVar44 + uVar31);
        iVar11 = pZVar22->price;
        UVar9 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar23 + -1),1,local_c0,2);
        UVar10 = ZSTD_litLengthPrice(UVar14,poVar7,2);
        UVar15 = ZSTD_litLengthPrice(UVar14 - 1,poVar7,2);
        iVar13 = (UVar10 + UVar9 + iVar11) - UVar15;
        pZVar3 = pZVar5 + uVar31;
        iVar11 = pZVar5[uVar31].price;
        if (iVar13 <= pZVar5[uVar31].price) {
          pZVar3->off = 0;
          pZVar3->mlen = 0;
          pZVar3->litlen = UVar14;
          pZVar3->price = iVar13;
          *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar22->rep;
          pZVar3->rep[2] = pZVar22->rep[2];
          iVar11 = iVar13;
        }
        if (local_d0 < puVar23) goto LAB_003cb6e9;
        if (uVar8 != uVar35) {
          UVar14 = pZVar3->mlen;
          UVar9 = 0;
          if (UVar14 == 0) {
            UVar9 = pZVar3->litlen;
          }
          local_50 = uVar31 * 0x1c;
          UVar10 = ZSTD_litLengthPrice(0,local_c0,2);
          pUVar32 = local_90;
          pBVar45 = (ms->window).base;
          uVar43 = (ulong)ms->nextToUpdate;
          if (puVar23 < pBVar45 + uVar43) goto LAB_003cb6e9;
          UVar15 = (ms->cParams).minMatch;
          iVar13 = (int)puVar23;
          uVar38 = iVar13 - (int)pBVar45;
          for (; (uint)uVar43 < uVar38; uVar43 = (ulong)((uint)uVar43 + UVar16)) {
            UVar16 = ZSTD_insertBt1(ms,pBVar45 + uVar43,pBVar2,UVar15,0);
          }
          ms->nextToUpdate = uVar38;
          if (1 < UVar15 - 6) {
            if (UVar15 == 5) {
              uVar43 = (ulong)(uint)(UVar14 != 0);
              uVar38 = (ms->cParams).targetLength;
              if (0xffe < uVar38) {
                uVar38 = 0xfff;
              }
              local_100 = (U32 *)(ms->window).base;
              uVar41 = iVar13 - (int)local_100;
              local_108 = (uint *)(ulong)uVar41;
              local_78 = (ulong)(*(long *)puVar23 * -0x30e4432345000000) >>
                         (-(char)(ms->cParams).hashLog & 0x3fU);
              uVar37 = 0;
              local_e0 = ms->chainTable;
              uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar13 = uVar41 - uVar35;
              if (uVar41 < uVar35) {
                iVar13 = 0;
              }
              local_c8 = CONCAT44(local_c8._4_4_,iVar13);
              UVar15 = (ms->window).lowLimit;
              local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
              local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35);
              uVar33 = (ulong)((uVar35 & uVar41) * 2);
              local_178 = local_e0 + uVar33;
              local_170 = local_e0 + uVar33 + 1;
              UVar15 = (ms->window).dictLimit;
              iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_80 = ms->hashTable;
              uVar35 = ms->hashTable[local_78];
              iVar13 = uVar41 + 9;
              uVar33 = uVar43 + 3;
              local_98 = puVar23 + 1;
              local_88 = (U32 *)CONCAT44(local_88._4_4_,uVar38);
              puVar19 = local_d8;
              for (; uVar43 < uVar33; uVar43 = uVar43 + 1) {
                if (uVar43 == 3) {
                  uVar39 = pZVar3->rep[0] - 1;
                }
                else {
                  uVar39 = pUVar32[uVar31 * 7 + uVar43];
                }
                uVar36 = 0;
                if ((uVar39 - 1 < uVar41 - UVar15) &&
                   (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
                  local_110 = puVar19;
                  sVar18 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar39),
                                      pBVar2);
                  uVar36 = (int)sVar18 + 4;
                  puVar19 = local_110;
                  uVar38 = (uint)local_88;
                }
                puVar34 = (uint *)(ulong)uVar36;
                if (puVar19 < puVar34) {
                  pZVar4[uVar37].off = (int)uVar43 - (uint)(UVar14 != 0);
                  pZVar4[uVar37].len = uVar36;
                  uVar37 = (ulong)((int)uVar37 + 1);
                  if ((uVar38 < uVar36) ||
                     (puVar19 = puVar34, (BYTE *)((long)puVar23 + (long)puVar34) == pBVar2))
                  goto LAB_003cb4ee;
                }
              }
              local_80[local_78] = (U32)local_108;
              local_108 = (uint *)(ulong)((U32)local_108 + 2);
              puVar34 = (uint *)0x0;
              puVar24 = (uint *)0x0;
              while( true ) {
                bVar46 = iVar12 == 0;
                iVar12 = iVar12 + -1;
                iVar17 = iVar13;
                if ((bVar46) || (uVar35 < (uint)local_118)) break;
                puVar25 = puVar34;
                if (puVar24 < puVar34) {
                  puVar25 = puVar24;
                }
                lVar21 = (ulong)uVar35 + (long)local_100;
                sVar18 = ZSTD_count((BYTE *)((long)puVar23 + (long)puVar25),
                                    (BYTE *)(lVar21 + (long)puVar25),pBVar2);
                puVar25 = (uint *)(sVar18 + (long)puVar25);
                if (puVar19 < puVar25) {
                  iVar17 = uVar35 + (U32)puVar25;
                  if (puVar25 <= (uint *)(ulong)(iVar13 - uVar35)) {
                    iVar17 = iVar13;
                  }
                  pZVar4[uVar37].off = (int)local_108 - uVar35;
                  pZVar4[uVar37].len = (U32)puVar25;
                  uVar37 = (ulong)((int)uVar37 + 1);
                  if (((uint *)0x1000 < puVar25) ||
                     (puVar19 = puVar25, iVar13 = iVar17,
                     (BYTE *)((long)puVar23 + (long)puVar25) == pBVar2)) break;
                }
                puVar28 = local_e0 + (uVar35 & (uint)local_f8) * 2;
                if (*(byte *)(lVar21 + (long)puVar25) < *(byte *)((long)puVar23 + (long)puVar25)) {
                  *local_178 = uVar35;
                  if (uVar35 <= (uint)local_c8) goto LAB_003cb2bb;
                  puVar28 = puVar28 + 1;
                  puVar24 = puVar25;
                  local_178 = puVar28;
                }
                else {
                  *local_170 = uVar35;
                  local_170 = puVar28;
                  puVar34 = puVar25;
                  if (uVar35 <= (uint)local_c8) goto LAB_003cb2a8;
                }
                uVar35 = *puVar28;
              }
            }
            else {
              if (UVar15 == 3) {
                uVar43 = (ulong)(uint)(UVar14 != 0);
                uVar38 = (ms->cParams).targetLength;
                if (0xffe < uVar38) {
                  uVar38 = 0xfff;
                }
                pBVar45 = (ms->window).base;
                uVar41 = iVar13 - (int)pBVar45;
                local_78 = (ulong)(*puVar23 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU))
                ;
                uVar37 = 0;
                local_100 = ms->chainTable;
                uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                iVar13 = uVar41 - uVar35;
                if (uVar41 < uVar35) {
                  iVar13 = 0;
                }
                local_f8 = (U32 *)CONCAT44(local_f8._4_4_,iVar13);
                UVar15 = (ms->window).lowLimit;
                uVar39 = UVar15 + (UVar15 == 0);
                local_118 = (uint *)CONCAT44(local_118._4_4_,uVar35);
                uVar33 = (ulong)((uVar35 & uVar41) * 2);
                local_110 = local_100 + uVar33;
                local_190 = local_100 + uVar33 + 1;
                UVar15 = (ms->window).dictLimit;
                iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                pUVar20 = (U32 *)(ulong)-(uint)(UVar14 != 0);
                local_80 = ms->hashTable;
                puVar34 = (uint *)(ulong)ms->hashTable[local_78];
                local_c8 = (ulong)uVar41;
                iVar13 = uVar41 + 9;
                uVar33 = uVar43 + 3;
                local_98 = (uint *)((long)puVar23 + 3);
                local_88 = pUVar20;
                puVar19 = local_d8;
                local_108 = puVar34;
                for (; uVar43 < uVar33; uVar43 = uVar43 + 1) {
                  if (uVar43 == 3) {
                    uVar35 = pZVar3->rep[0] - 1;
                  }
                  else {
                    uVar35 = pUVar32[uVar31 * 7 + uVar43];
                  }
                  uVar36 = 0;
                  if ((uVar35 - 1 < uVar41 - UVar15) &&
                     (uVar36 = 0,
                     ((*(uint *)((long)puVar23 - (ulong)uVar35) ^ *puVar23) & 0xffffff) == 0)) {
                    local_e0 = puVar19;
                    sVar18 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar35),
                                        pBVar2);
                    uVar36 = (int)sVar18 + 3;
                    puVar34 = local_108;
                    puVar19 = local_e0;
                    pUVar20 = local_88;
                  }
                  puVar24 = (uint *)(ulong)uVar36;
                  if (puVar19 < puVar24) {
                    pZVar4[uVar37].off = (int)pUVar20 + (int)uVar43;
                    pZVar4[uVar37].len = uVar36;
                    uVar37 = (ulong)((int)uVar37 + 1);
                    if ((uVar38 < uVar36) ||
                       (puVar19 = puVar24, (BYTE *)((long)puVar23 + (long)puVar24) == pBVar2))
                    goto LAB_003cb4ee;
                  }
                }
                if ((((puVar19 < (uint *)0x3) &&
                     (UVar15 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar23),
                     puVar34 = local_108, uVar39 <= UVar15)) &&
                    (uVar35 = (int)local_c8 - UVar15, uVar35 < 0x40000)) &&
                   (puVar24 = (uint *)ZSTD_count((BYTE *)puVar23,pBVar45 + UVar15,pBVar2),
                   puVar34 = local_108, (uint *)0x2 < puVar24)) {
                  pZVar4->off = uVar35 + 2;
                  pZVar4->len = (U32)puVar24;
                  uVar37 = 1;
                  puVar19 = puVar24;
                  if (puVar24 <= (uint *)(ulong)uVar38 &&
                      (BYTE *)((long)puVar24 + (long)puVar23) != pBVar2) goto LAB_003cb2ff;
                  UVar15 = (int)local_c8 + 1;
                  uVar37 = 1;
                }
                else {
LAB_003cb2ff:
                  local_80[local_78] = (U32)local_c8;
                  local_c8 = (ulong)((U32)local_c8 + 2);
                  puVar24 = (uint *)0x0;
                  puVar25 = (uint *)0x0;
LAB_003cb333:
                  bVar46 = iVar12 == 0;
                  iVar12 = iVar12 + -1;
                  puVar28 = local_110;
                  if ((bVar46) || (uVar38 = (uint)puVar34, uVar38 < uVar39)) goto LAB_003cb4dd;
                  puVar26 = puVar24;
                  if (puVar25 < puVar24) {
                    puVar26 = puVar25;
                  }
                  sVar18 = ZSTD_count((BYTE *)((long)puVar23 + (long)puVar26),
                                      pBVar45 + ((ulong)puVar34 & 0xffffffff) + (long)puVar26,pBVar2
                                     );
                  puVar26 = (uint *)(sVar18 + (long)puVar26);
                  puVar28 = local_110;
                  if (puVar19 < puVar26) {
                    iVar17 = uVar38 + (U32)puVar26;
                    if (puVar26 <= (uint *)(ulong)(iVar13 - uVar38)) {
                      iVar17 = iVar13;
                    }
                    pZVar4[uVar37].off = (int)local_c8 - uVar38;
                    pZVar4[uVar37].len = (U32)puVar26;
                    uVar37 = (ulong)((int)uVar37 + 1);
                    iVar13 = iVar17;
                    if (((uint *)0x1000 < puVar26) ||
                       (puVar19 = puVar26, (BYTE *)((long)puVar23 + (long)puVar26) == pBVar2))
                    goto LAB_003cb4dd;
                  }
                  puVar27 = local_100 + (uVar38 & (uint)local_118) * 2;
                  if (*(byte *)((long)puVar23 + (long)puVar26) <=
                      (pBVar45 + ((ulong)puVar34 & 0xffffffff))[(long)puVar26]) {
                    *local_190 = uVar38;
                    local_190 = puVar27;
                    puVar24 = puVar26;
                    if (uVar38 <= (uint)local_f8) {
                      local_190 = &local_11c;
                      goto LAB_003cb4dd;
                    }
LAB_003cb486:
                    puVar34 = (uint *)(ulong)*puVar27;
                    goto LAB_003cb333;
                  }
                  *local_110 = uVar38;
                  if ((uint)local_f8 < uVar38) {
                    puVar27 = puVar27 + 1;
                    puVar25 = puVar26;
                    local_110 = puVar27;
                    goto LAB_003cb486;
                  }
                  puVar28 = &local_11c;
LAB_003cb4dd:
                  *local_190 = 0;
                  *puVar28 = 0;
                  UVar15 = iVar13 - 8;
                }
                ms->nextToUpdate = UVar15;
                goto LAB_003cb4ee;
              }
              uVar43 = (ulong)(uint)(UVar14 != 0);
              uVar38 = (ms->cParams).targetLength;
              if (0xffe < uVar38) {
                uVar38 = 0xfff;
              }
              local_100 = (U32 *)(ms->window).base;
              uVar41 = iVar13 - (int)local_100;
              local_108 = (uint *)(ulong)uVar41;
              local_78 = (ulong)(*puVar23 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
              uVar37 = 0;
              local_e0 = ms->chainTable;
              uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
              iVar13 = uVar41 - uVar35;
              if (uVar41 < uVar35) {
                iVar13 = 0;
              }
              local_c8 = CONCAT44(local_c8._4_4_,iVar13);
              UVar15 = (ms->window).lowLimit;
              local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
              local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35);
              uVar33 = (ulong)((uVar35 & uVar41) * 2);
              local_178 = local_e0 + uVar33;
              local_170 = local_e0 + uVar33 + 1;
              UVar15 = (ms->window).dictLimit;
              iVar12 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
              local_80 = ms->hashTable;
              uVar35 = ms->hashTable[local_78];
              iVar13 = uVar41 + 9;
              uVar33 = uVar43 + 3;
              local_98 = puVar23 + 1;
              local_88 = (U32 *)CONCAT44(local_88._4_4_,uVar38);
              puVar19 = local_d8;
              for (; uVar43 < uVar33; uVar43 = uVar43 + 1) {
                if (uVar43 == 3) {
                  uVar39 = pZVar3->rep[0] - 1;
                }
                else {
                  uVar39 = pUVar32[uVar31 * 7 + uVar43];
                }
                uVar36 = 0;
                if ((uVar39 - 1 < uVar41 - UVar15) &&
                   (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
                  local_110 = puVar19;
                  sVar18 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar39),
                                      pBVar2);
                  uVar36 = (int)sVar18 + 4;
                  puVar19 = local_110;
                  uVar38 = (uint)local_88;
                }
                puVar34 = (uint *)(ulong)uVar36;
                if (puVar19 < puVar34) {
                  pZVar4[uVar37].off = (int)uVar43 - (uint)(UVar14 != 0);
                  pZVar4[uVar37].len = uVar36;
                  uVar37 = (ulong)((int)uVar37 + 1);
                  if ((uVar38 < uVar36) ||
                     (puVar19 = puVar34, (BYTE *)((long)puVar23 + (long)puVar34) == pBVar2))
                  goto LAB_003cb4ee;
                }
              }
              local_80[local_78] = (U32)local_108;
              local_108 = (uint *)(ulong)((U32)local_108 + 2);
              puVar34 = (uint *)0x0;
              puVar24 = (uint *)0x0;
              while( true ) {
                bVar46 = iVar12 == 0;
                iVar12 = iVar12 + -1;
                iVar17 = iVar13;
                if ((bVar46) || (uVar35 < (uint)local_118)) break;
                puVar25 = puVar34;
                if (puVar24 < puVar34) {
                  puVar25 = puVar24;
                }
                lVar21 = (ulong)uVar35 + (long)local_100;
                sVar18 = ZSTD_count((BYTE *)((long)puVar23 + (long)puVar25),
                                    (BYTE *)(lVar21 + (long)puVar25),pBVar2);
                puVar25 = (uint *)(sVar18 + (long)puVar25);
                if (puVar19 < puVar25) {
                  iVar17 = uVar35 + (U32)puVar25;
                  if (puVar25 <= (uint *)(ulong)(iVar13 - uVar35)) {
                    iVar17 = iVar13;
                  }
                  pZVar4[uVar37].off = (int)local_108 - uVar35;
                  pZVar4[uVar37].len = (U32)puVar25;
                  uVar37 = (ulong)((int)uVar37 + 1);
                  if (((uint *)0x1000 < puVar25) ||
                     (puVar19 = puVar25, iVar13 = iVar17,
                     (BYTE *)((long)puVar23 + (long)puVar25) == pBVar2)) break;
                }
                puVar28 = local_e0 + (uVar35 & (uint)local_f8) * 2;
                if (*(byte *)(lVar21 + (long)puVar25) < *(byte *)((long)puVar23 + (long)puVar25)) {
                  *local_178 = uVar35;
                  if (uVar35 <= (uint)local_c8) goto LAB_003cb2bb;
                  puVar28 = puVar28 + 1;
                  puVar24 = puVar25;
                  local_178 = puVar28;
                }
                else {
                  *local_170 = uVar35;
                  local_170 = puVar28;
                  puVar34 = puVar25;
                  if (uVar35 <= (uint)local_c8) goto LAB_003cb2a8;
                }
                uVar35 = *puVar28;
              }
            }
            goto LAB_003cb2cc;
          }
          uVar43 = (ulong)(UVar14 != 0);
          uVar38 = (ms->cParams).targetLength;
          if (0xffe < uVar38) {
            uVar38 = 0xfff;
          }
          local_100 = (U32 *)(ms->window).base;
          uVar41 = iVar13 - (int)local_100;
          local_108 = (uint *)(ulong)uVar41;
          local_78 = (ulong)(*(long *)puVar23 * -0x30e4432340650000) >>
                     (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar37 = 0;
          local_e0 = ms->chainTable;
          uVar35 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar13 = uVar41 - uVar35;
          if (uVar41 < uVar35) {
            iVar13 = 0;
          }
          local_c8 = CONCAT44(local_c8._4_4_,iVar13);
          UVar15 = (ms->window).lowLimit;
          local_118 = (uint *)CONCAT44(local_118._4_4_,UVar15 + (UVar15 == 0));
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar35);
          uVar33 = (ulong)((uVar35 & uVar41) * 2);
          local_178 = local_e0 + uVar33;
          local_170 = local_e0 + uVar33 + 1;
          UVar15 = (ms->window).dictLimit;
          iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_80 = ms->hashTable;
          uVar35 = ms->hashTable[local_78];
          iVar12 = uVar41 + 9;
          uVar33 = uVar43 + 3;
          local_98 = puVar23 + 1;
          local_88 = (U32 *)CONCAT44(local_88._4_4_,uVar38);
          puVar19 = local_d8;
          for (; uVar43 < uVar33; uVar43 = uVar43 + 1) {
            if (uVar43 == 3) {
              uVar39 = pZVar3->rep[0] - 1;
            }
            else {
              uVar39 = pUVar32[uVar31 * 7 + uVar43];
            }
            uVar36 = 0;
            if ((uVar39 - 1 < uVar41 - UVar15) &&
               (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
              local_110 = puVar19;
              sVar18 = ZSTD_count((BYTE *)local_98,(BYTE *)((long)local_98 - (ulong)uVar39),pBVar2);
              uVar36 = (int)sVar18 + 4;
              puVar19 = local_110;
              uVar38 = (uint)local_88;
            }
            puVar34 = (uint *)(ulong)uVar36;
            if (puVar19 < puVar34) {
              pZVar4[uVar37].off = (int)uVar43 - (uint)(UVar14 != 0);
              pZVar4[uVar37].len = uVar36;
              uVar37 = (ulong)((int)uVar37 + 1);
              if ((uVar38 < uVar36) ||
                 (puVar19 = puVar34, (BYTE *)((long)puVar23 + (long)puVar34) == pBVar2))
              goto LAB_003cb4ee;
            }
          }
          local_80[local_78] = (U32)local_108;
          local_108 = (uint *)(ulong)((U32)local_108 + 2);
          puVar34 = (uint *)0x0;
          puVar24 = (uint *)0x0;
LAB_003ca8da:
          bVar46 = iVar13 == 0;
          iVar13 = iVar13 + -1;
          iVar17 = iVar12;
          if ((bVar46) || (uVar35 < (uint)local_118)) goto LAB_003cb293;
          puVar25 = puVar34;
          if (puVar24 < puVar34) {
            puVar25 = puVar24;
          }
          lVar21 = (ulong)uVar35 + (long)local_100;
          sVar18 = ZSTD_count((BYTE *)((long)puVar23 + (long)puVar25),
                              (BYTE *)((long)puVar25 + lVar21),pBVar2);
          puVar25 = (uint *)(sVar18 + (long)puVar25);
          if (puVar19 < puVar25) {
            iVar17 = uVar35 + (U32)puVar25;
            if (puVar25 <= (uint *)(ulong)(iVar12 - uVar35)) {
              iVar17 = iVar12;
            }
            pZVar4[uVar37].off = (int)local_108 - uVar35;
            pZVar4[uVar37].len = (U32)puVar25;
            uVar37 = (ulong)((int)uVar37 + 1);
            if (((uint *)0x1000 < puVar25) ||
               (puVar19 = puVar25, iVar12 = iVar17,
               (BYTE *)((long)puVar23 + (long)puVar25) == pBVar2)) goto LAB_003cb293;
          }
          puVar28 = local_e0 + (uVar35 & (uint)local_f8) * 2;
          iVar17 = iVar12;
          if (*(byte *)((long)puVar23 + (long)puVar25) <= *(byte *)(lVar21 + (long)puVar25)) {
            *local_170 = uVar35;
            local_170 = puVar28;
            puVar34 = puVar25;
            if (uVar35 <= (uint)local_c8) {
              local_170 = &local_11c;
              goto LAB_003cb293;
            }
LAB_003caa41:
            uVar35 = *puVar28;
            goto LAB_003ca8da;
          }
          *local_178 = uVar35;
          if ((uint)local_c8 < uVar35) {
            puVar28 = puVar28 + 1;
            puVar24 = puVar25;
            local_178 = puVar28;
            goto LAB_003caa41;
          }
          local_178 = &local_11c;
LAB_003cb293:
          *local_170 = 0;
          *local_178 = 0;
          ms->nextToUpdate = iVar17 - 8;
          goto LAB_003cb4ee;
        }
      }
      uVar29 = uVar29 & 0xffffffff;
      local_64 = pZVar5[uVar29].price;
      UVar10 = pZVar5[uVar29].off;
      uVar38 = pZVar5[uVar29].mlen;
      UVar9 = pZVar5[uVar29].litlen;
      local_58 = pZVar5[uVar29].rep[2];
      local_60 = *(undefined8 *)pZVar5[uVar29].rep;
      uVar8 = uVar35 - (uVar38 + UVar9);
      if (uVar35 < uVar38 + UVar9) {
        uVar8 = 0;
      }
      uVar29 = (ulong)uVar8;
    }
LAB_003cb735:
    uVar8 = (int)uVar29 + 1;
    pZVar5[uVar8].price = local_64;
    pZVar5[uVar8].off = UVar10;
    pZVar5[uVar8].mlen = uVar38;
    pZVar5[uVar8].litlen = UVar9;
    *(undefined8 *)pZVar5[uVar8].rep = local_60;
    pZVar5[uVar8].rep[2] = local_58;
    uVar43 = uVar29;
    while( true ) {
      uVar38 = (uint)uVar29;
      uVar35 = (uint)uVar43;
      if (uVar38 == 0) break;
      uVar39 = pZVar5[uVar29].litlen + pZVar5[uVar29].mlen;
      pZVar22 = pZVar5 + uVar29;
      iVar11 = pZVar22->price;
      UVar9 = pZVar22->off;
      UVar10 = pZVar22->mlen;
      UVar15 = pZVar22->litlen;
      pZVar22 = pZVar5 + uVar29;
      UVar14 = pZVar22->rep[0];
      uVar6 = *(undefined8 *)(&pZVar22->litlen + 2);
      pZVar3 = pZVar5 + uVar43;
      pZVar3->litlen = pZVar22->litlen;
      pZVar3->rep[0] = UVar14;
      *(undefined8 *)(&pZVar3->litlen + 2) = uVar6;
      pZVar22 = pZVar5 + uVar43;
      pZVar22->price = iVar11;
      pZVar22->off = UVar9;
      pZVar22->mlen = UVar10;
      pZVar22->litlen = UVar15;
      uVar41 = uVar38 - uVar39;
      if (uVar38 < uVar39) {
        uVar41 = 0;
      }
      uVar29 = (ulong)uVar41;
      uVar43 = (ulong)(uVar35 - 1);
    }
    local_160 = local_f0 & 0xffffffff;
    local_1b0 = local_f0 >> 0x20;
    while( true ) {
      uVar35 = uVar35 + 1;
      if (uVar8 < uVar35) break;
      uVar38 = pZVar5[uVar35].litlen;
      uVar29 = (ulong)uVar38;
      UVar14 = pZVar5[uVar35].mlen;
      if (UVar14 == 0) {
        puVar44 = (uint *)(uVar29 + (long)local_148);
      }
      else {
        uVar41 = pZVar5[uVar35].off;
        if (uVar41 < 3) {
          uVar39 = (uVar29 == 0) + uVar41;
          if (uVar39 != 0) {
            if (uVar39 == 3) {
              uVar43 = (ulong)((int)local_160 - 1);
LAB_003cb865:
              local_e8 = (U32)local_1b0;
            }
            else {
              uVar43 = (ulong)*(uint *)((long)&local_f0 + (ulong)uVar39 * 4);
              if (uVar39 != 1) goto LAB_003cb865;
            }
            uVar39 = (uint)uVar43;
            goto LAB_003cb88a;
          }
        }
        else {
          local_e8 = (U32)local_1b0;
          uVar39 = uVar41 - 2;
          uVar43 = (ulong)uVar39;
LAB_003cb88a:
          local_f0 = CONCAT44((int)local_160,uVar39);
          local_1b0 = local_160;
          local_160 = uVar43;
        }
        ZSTD_updateStats(local_c0,uVar38,(BYTE *)local_148,uVar41,UVar14);
        ZSTD_storeSeq(local_48,uVar29,local_148,uVar41,(ulong)(UVar14 - 3));
        puVar44 = (uint *)((long)local_148 + (ulong)(uVar38 + UVar14));
        local_148 = puVar44;
      }
    }
    ZSTD_setBasePrices(local_c0,2);
    ssPtr = local_48;
  }
  goto LAB_003c9081;
LAB_003cb2a8:
  local_170 = &local_11c;
  iVar17 = iVar13;
  goto LAB_003cb2cc;
LAB_003cb2bb:
  local_178 = &local_11c;
  iVar17 = iVar13;
LAB_003cb2cc:
  *local_170 = 0;
  *local_178 = 0;
  ms->nextToUpdate = iVar17 - 8;
LAB_003cb4ee:
  if ((int)uVar37 != 0) {
    uVar35 = (int)uVar37 - 1;
    uVar38 = pZVar4[uVar35].len;
    if (((uint)local_a0 < uVar38) || (0xfff < uVar38 + uVar8)) {
      UVar14 = 0;
      if (pZVar3->mlen == 0) {
        UVar14 = pZVar3->litlen;
      }
      UVar10 = pZVar4[uVar35].off;
      uVar29 = (ulong)(uVar8 - UVar14);
      if (0x1000 < uVar8 - UVar14) {
        uVar29 = 0;
      }
      goto LAB_003cb735;
    }
    pUVar32 = (U32 *)((long)pZVar5->rep + local_50);
    for (uVar43 = 0; uVar43 != uVar37; uVar43 = uVar43 + 1) {
      UVar15 = pZVar4[uVar43].off;
      rVar47 = ZSTD_updateRep(pUVar32,UVar15,(uint)(UVar14 != 0));
      uVar38 = (uint)local_b0;
      if (uVar43 != 0) {
        uVar38 = pZVar4[uVar43 - 1].len + 1;
      }
      uVar35 = pZVar4[uVar43].len;
      uVar41 = 0x1f;
      if (UVar15 + 1 != 0) {
        for (; UVar15 + 1 >> uVar41 == 0; uVar41 = uVar41 - 1) {
        }
      }
      for (; uVar38 <= uVar35; uVar35 = uVar35 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar39 = uVar35 - 2;
          iVar13 = 0x1f;
          if (uVar39 != 0) {
            for (; uVar39 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          iVar13 = (iVar13 + uVar41) * 0x100 + (uVar39 * 0x100 >> ((byte)iVar13 & 0x1f)) + 0x1000;
        }
        else {
          uVar36 = uVar35 - 3;
          uVar39 = (ms->opt).offCodeFreq[uVar41] + 1;
          iVar13 = 0x1f;
          if (uVar39 != 0) {
            for (; uVar39 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          if (uVar36 < 0x80) {
            uVar36 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar36];
          }
          else {
            uVar42 = 0x1f;
            if (uVar36 != 0) {
              for (; uVar36 >> uVar42 == 0; uVar42 = uVar42 - 1) {
              }
            }
            uVar36 = (uVar42 ^ 0xffffffe0) + 0x44;
          }
          uVar42 = (ms->opt).matchLengthFreq[uVar36] + 1;
          iVar12 = 0x1f;
          if (uVar42 != 0) {
            for (; uVar42 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          iVar13 = ((ML_bits[uVar36] + uVar41) - (iVar13 + iVar12)) * 0x100 +
                   (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar39 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                   (uVar42 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
        }
        iVar13 = iVar13 + UVar10 + iVar11;
        uVar31 = (ulong)(uVar35 + uVar8);
        if (((uint)uVar29 < uVar35 + uVar8) || (iVar13 < pZVar5[uVar31].price)) {
          uVar29 = uVar29 & 0xffffffff;
          pZVar22 = local_70 + uVar29;
          for (; uVar29 < uVar31; uVar29 = uVar29 + 1) {
            pZVar22->price = 0x40000000;
            pZVar22 = pZVar22 + 1;
          }
          pZVar5[uVar31].mlen = uVar35;
          pZVar5[uVar31].off = UVar15;
          pZVar5[uVar31].litlen = UVar9;
          pZVar5[uVar31].price = iVar13;
          *(long *)pZVar5[uVar31].rep = rVar47.rep._0_8_;
          pZVar5[uVar31].rep[2] = rVar47.rep[2];
        }
      }
    }
  }
LAB_003cb6e9:
  uVar31 = (ulong)(uVar8 + 1);
  goto LAB_003ca296;
LAB_003cc845:
  local_1b8 = (U32 *)&local_f0;
  local_138 = local_198;
  goto LAB_003cca05;
LAB_003cc9cf:
  local_138 = (U32 *)&local_f0;
LAB_003cca05:
  *local_1b8 = 0;
  *local_138 = 0;
  UVar14 = iVar11 - 8;
LAB_003cca0e:
  ms->nextToUpdate = UVar14;
LAB_003cca16:
  poVar7 = local_c0;
  src = local_b8;
  if ((int)uVar43 == 0) {
LAB_003cca28:
    puVar44 = (uint *)((long)puVar44 + 1);
  }
  else {
    for (lVar21 = 4; lVar21 != 7; lVar21 = lVar21 + 1) {
      pZVar5->rep[lVar21 + -4] = local_a8[lVar21 + -4];
    }
    pZVar5->mlen = 0;
    pZVar5->litlen = (U32)local_160;
    iVar11 = ZSTD_literalsContribution((BYTE *)local_b8,(U32)local_160,local_c0,2);
    pZVar5->price = iVar11;
    uVar8 = (int)uVar43 - 1;
    uVar38 = pZVar4[uVar8].len;
    if ((uint)local_50 < uVar38) {
      UVar9 = pZVar4[uVar8].off;
      uVar29 = 0;
      iVar11 = (int)local_98;
    }
    else {
      UVar14 = ZSTD_litLengthPrice(0,poVar7,2);
      pZVar22 = local_70;
      for (uVar29 = 1; uVar29 < local_40; uVar29 = uVar29 + 1) {
        pZVar22->price = 0x40000000;
        pZVar22 = pZVar22 + 1;
      }
      for (uVar37 = 0; uVar37 != uVar43; uVar37 = uVar37 + 1) {
        UVar9 = pZVar4[uVar37].off;
        uVar38 = pZVar4[uVar37].len;
        rVar47 = ZSTD_updateRep(local_a8,UVar9,(uint)((U32)local_160 == 0));
        uVar8 = 0x1f;
        if (UVar9 + 1 != 0) {
          for (; UVar9 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        uVar35 = (int)uVar29 * 0x100 - 0x200;
        while (uVar41 = (uint)uVar29, uVar41 <= uVar38) {
          if ((ms->opt).priceType == zop_predef) {
            iVar13 = 0x1f;
            if (uVar41 - 2 != 0) {
              for (; uVar41 - 2 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            iVar13 = (iVar13 + uVar8) * 0x100 + (uVar35 >> ((byte)iVar13 & 0x1f)) + 0x1000;
          }
          else {
            uVar36 = uVar41 - 3;
            uVar39 = (ms->opt).offCodeFreq[uVar8] + 1;
            iVar13 = 0x1f;
            if (uVar39 != 0) {
              for (; uVar39 >> iVar13 == 0; iVar13 = iVar13 + -1) {
              }
            }
            if (uVar36 < 0x80) {
              uVar36 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar36];
            }
            else {
              uVar42 = 0x1f;
              if (uVar36 != 0) {
                for (; uVar36 >> uVar42 == 0; uVar42 = uVar42 - 1) {
                }
              }
              uVar36 = (uVar42 ^ 0xffffffe0) + 0x44;
            }
            uVar42 = (ms->opt).matchLengthFreq[uVar36] + 1;
            iVar12 = 0x1f;
            if (uVar42 != 0) {
              for (; uVar42 >> iVar12 == 0; iVar12 = iVar12 + -1) {
              }
            }
            iVar13 = ((ML_bits[uVar36] + uVar8) - (iVar13 + iVar12)) * 0x100 +
                     (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                     ((uVar39 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                     (uVar42 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
          }
          uVar29 = uVar29 & 0xffffffff;
          pZVar5[uVar29].mlen = uVar41;
          pZVar5[uVar29].off = UVar9;
          pZVar5[uVar29].litlen = (U32)local_160;
          pZVar5[uVar29].price = iVar13 + UVar14 + iVar11;
          *(long *)pZVar5[uVar29].rep = rVar47.rep._0_8_;
          pZVar5[uVar29].rep[2] = rVar47.rep[2];
          uVar35 = uVar35 + 0x100;
          uVar29 = (ulong)(uVar41 + 1);
        }
      }
      uVar29 = (ulong)((int)uVar29 - 1);
      uVar43 = 1;
LAB_003ccc94:
      poVar7 = local_c0;
      uVar35 = (uint)uVar43;
      uVar8 = (uint)uVar29;
      if (uVar35 <= uVar8) {
        pZVar22 = pZVar5 + (uVar35 - 1);
        UVar14 = 1;
        if (pZVar5[uVar35 - 1].mlen == 0) {
          UVar14 = pZVar22->litlen + 1;
        }
        puVar23 = (uint *)((long)puVar44 + uVar43);
        iVar11 = pZVar22->price;
        UVar9 = ZSTD_rawLiteralsCost((BYTE *)((long)puVar23 + -1),1,local_c0,2);
        UVar10 = ZSTD_litLengthPrice(UVar14,poVar7,2);
        UVar15 = ZSTD_litLengthPrice(UVar14 - 1,poVar7,2);
        iVar13 = (UVar10 + UVar9 + iVar11) - UVar15;
        pZVar3 = pZVar5 + uVar43;
        iVar11 = pZVar5[uVar43].price;
        if (iVar13 <= pZVar5[uVar43].price) {
          pZVar3->off = 0;
          pZVar3->mlen = 0;
          pZVar3->litlen = UVar14;
          pZVar3->price = iVar13;
          *(undefined8 *)pZVar3->rep = *(undefined8 *)pZVar22->rep;
          pZVar3->rep[2] = pZVar22->rep[2];
          iVar11 = iVar13;
        }
        if (local_110 < puVar23) goto LAB_003ce086;
        if (uVar35 != uVar8) {
          UVar14 = pZVar3->mlen;
          local_160._0_4_ = 0;
          if (UVar14 == 0) {
            local_160._0_4_ = pZVar3->litlen;
          }
          local_c8 = uVar43 * 0x1c;
          UVar9 = ZSTD_litLengthPrice(0,local_c0,2);
          pUVar32 = local_88;
          pBVar45 = (ms->window).base;
          uVar37 = (ulong)ms->nextToUpdate;
          if (puVar23 < pBVar45 + uVar37) goto LAB_003ce086;
          UVar10 = (ms->cParams).minMatch;
          iVar13 = (int)puVar23;
          uVar38 = iVar13 - (int)pBVar45;
          for (; (uint)uVar37 < uVar38; uVar37 = (ulong)((uint)uVar37 + UVar15)) {
            UVar15 = ZSTD_insertBt1(ms,pBVar45 + uVar37,pBVar2,UVar10,0);
          }
          ms->nextToUpdate = uVar38;
          local_1a8 = (U32 *)local_b0;
          if (UVar10 - 6 < 2) {
            uVar37 = (ulong)(UVar14 != 0);
            uVar38 = (ms->cParams).targetLength;
            if (0xffe < uVar38) {
              uVar38 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar41 = iVar13 - (int)local_118;
            local_e0 = (uint *)(ulong)uVar41;
            local_a0 = (ulong)(*(long *)puVar23 * -0x30e4432340650000) >>
                       (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar31 = 0;
            local_100 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar41 - uVar8;
            if (uVar41 < uVar8) {
              iVar13 = 0;
            }
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar41) * 2);
            local_178 = local_100 + uVar33;
            local_190 = local_100 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[local_a0];
            uVar33 = uVar37 + 3;
            local_108 = puVar23 + 1;
            for (; uVar37 < uVar33; uVar37 = uVar37 + 1) {
              if (uVar37 == 3) {
                uVar39 = pZVar3->rep[0] - 1;
              }
              else {
                uVar39 = pUVar32[uVar43 * 7 + uVar37];
              }
              uVar36 = 0;
              if ((uVar39 - 1 < uVar41 - UVar10) &&
                 (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
                sVar18 = ZSTD_count((BYTE *)local_108,(BYTE *)((long)local_108 - (ulong)uVar39),
                                    pBVar2);
                uVar36 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar36;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar37 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar36;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar38 < uVar36) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar23 + uVar30) == pBVar2))
                goto LAB_003cde81;
              }
            }
            local_90[local_a0] = (U32)local_e0;
            local_e0 = (uint *)(ulong)((U32)local_e0 + 2);
            uVar43 = 0;
            uVar37 = 0;
            iVar12 = uVar41 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar46 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar46) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar37;
              if (uVar43 < uVar37) {
                uVar33 = uVar43;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar23 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e0 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar23 + uVar33) == pBVar2)) break;
              }
              puVar34 = local_100 + (uVar8 & (uint)local_d8) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar23 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc40;
                puVar34 = puVar34 + 1;
                uVar43 = uVar33;
                uVar33 = uVar37;
                local_178 = puVar34;
              }
              else {
                *local_190 = uVar8;
                local_190 = puVar34;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc54;
              }
              uVar8 = *puVar34;
              uVar37 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_003cde70;
          }
          if (UVar10 == 5) {
            uVar37 = (ulong)(uint)(UVar14 != 0);
            uVar38 = (ms->cParams).targetLength;
            if (0xffe < uVar38) {
              uVar38 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar41 = iVar13 - (int)local_118;
            local_e0 = (uint *)(ulong)uVar41;
            local_a0 = (ulong)(*(long *)puVar23 * -0x30e4432345000000) >>
                       (-(char)(ms->cParams).hashLog & 0x3fU);
            uVar31 = 0;
            local_100 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar41 - uVar8;
            if (uVar41 < uVar8) {
              iVar13 = 0;
            }
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar41) * 2);
            local_178 = local_100 + uVar33;
            local_190 = local_100 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[local_a0];
            uVar33 = uVar37 + 3;
            local_108 = puVar23 + 1;
            for (; uVar37 < uVar33; uVar37 = uVar37 + 1) {
              if (uVar37 == 3) {
                uVar39 = pZVar3->rep[0] - 1;
              }
              else {
                uVar39 = pUVar32[uVar43 * 7 + uVar37];
              }
              uVar36 = 0;
              if ((uVar39 - 1 < uVar41 - UVar10) &&
                 (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
                sVar18 = ZSTD_count((BYTE *)local_108,(BYTE *)((long)local_108 - (ulong)uVar39),
                                    pBVar2);
                uVar36 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar36;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar37 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar36;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar38 < uVar36) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar23 + uVar30) == pBVar2))
                goto LAB_003cde81;
              }
            }
            local_90[local_a0] = (U32)local_e0;
            local_e0 = (uint *)(ulong)((U32)local_e0 + 2);
            uVar43 = 0;
            uVar37 = 0;
            iVar12 = uVar41 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar46 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar46) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar37;
              if (uVar43 < uVar37) {
                uVar33 = uVar43;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar23 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e0 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar23 + uVar33) == pBVar2)) break;
              }
              puVar34 = local_100 + (uVar8 & (uint)local_d8) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar23 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc40;
                puVar34 = puVar34 + 1;
                uVar43 = uVar33;
                uVar33 = uVar37;
                local_178 = puVar34;
              }
              else {
                *local_190 = uVar8;
                local_190 = puVar34;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc54;
              }
              uVar8 = *puVar34;
              uVar37 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_003cde70;
          }
          if (UVar10 != 3) {
            uVar37 = (ulong)(uint)(UVar14 != 0);
            uVar38 = (ms->cParams).targetLength;
            if (0xffe < uVar38) {
              uVar38 = 0xfff;
            }
            local_118 = (uint *)(ms->window).base;
            uVar41 = iVar13 - (int)local_118;
            local_e0 = (uint *)(ulong)uVar41;
            local_a0 = (ulong)(*puVar23 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
            uVar31 = 0;
            local_100 = ms->chainTable;
            uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
            iVar13 = uVar41 - uVar8;
            if (uVar41 < uVar8) {
              iVar13 = 0;
            }
            local_f8 = (U32 *)CONCAT44(local_f8._4_4_,iVar13);
            UVar10 = (ms->window).lowLimit;
            local_d0 = (uint *)CONCAT44(local_d0._4_4_,UVar10 + (UVar10 == 0));
            local_d8 = (uint *)CONCAT44(local_d8._4_4_,uVar8);
            uVar33 = (ulong)((uVar8 & uVar41) * 2);
            local_178 = local_100 + uVar33;
            local_190 = local_100 + uVar33 + 1;
            UVar10 = (ms->window).dictLimit;
            iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            local_90 = ms->hashTable;
            uVar8 = local_90[local_a0];
            uVar33 = uVar37 + 3;
            local_108 = puVar23 + 1;
            for (; uVar37 < uVar33; uVar37 = uVar37 + 1) {
              if (uVar37 == 3) {
                uVar39 = pZVar3->rep[0] - 1;
              }
              else {
                uVar39 = pUVar32[uVar43 * 7 + uVar37];
              }
              uVar36 = 0;
              if ((uVar39 - 1 < uVar41 - UVar10) &&
                 (uVar36 = 0, *puVar23 == *(uint *)((long)puVar23 - (ulong)uVar39))) {
                sVar18 = ZSTD_count((BYTE *)local_108,(BYTE *)((long)local_108 - (ulong)uVar39),
                                    pBVar2);
                uVar36 = (int)sVar18 + 4;
              }
              uVar30 = (ulong)uVar36;
              if (local_1a8 < uVar30) {
                pZVar4[uVar31].off = (int)uVar37 - (uint)(UVar14 != 0);
                pZVar4[uVar31].len = uVar36;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((uVar38 < uVar36) ||
                   (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar23 + uVar30) == pBVar2))
                goto LAB_003cde81;
              }
            }
            local_90[local_a0] = (U32)local_e0;
            local_e0 = (uint *)(ulong)((U32)local_e0 + 2);
            uVar43 = 0;
            uVar37 = 0;
            iVar12 = uVar41 + 9;
            while( true ) {
              puVar19 = local_118;
              bVar46 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_140 = local_178;
              iVar17 = iVar12;
              if ((bVar46) || (uVar8 < (uint)local_d0)) break;
              uVar33 = uVar37;
              if (uVar43 < uVar37) {
                uVar33 = uVar43;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar23 + uVar33),
                                  (BYTE *)((long)local_118 + uVar33 + uVar8),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar17 = uVar8 + (U32)uVar33;
                if (uVar33 <= iVar12 - uVar8) {
                  iVar17 = iVar12;
                }
                pZVar4[uVar31].off = (int)local_e0 - uVar8;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar23 + uVar33) == pBVar2)) break;
              }
              puVar34 = local_100 + (uVar8 & (uint)local_d8) * 2;
              if (*(byte *)((long)puVar19 + uVar33 + uVar8) < *(byte *)((long)puVar23 + uVar33)) {
                *local_178 = uVar8;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc40;
                puVar34 = puVar34 + 1;
                uVar43 = uVar33;
                uVar33 = uVar37;
                local_178 = puVar34;
              }
              else {
                *local_190 = uVar8;
                local_190 = puVar34;
                if (uVar8 <= (uint)local_f8) goto LAB_003cdc54;
              }
              uVar8 = *puVar34;
              uVar37 = uVar33;
              iVar12 = iVar17;
            }
            goto LAB_003cde70;
          }
          uVar37 = (ulong)(uint)(UVar14 != 0);
          uVar38 = (ms->cParams).targetLength;
          if (0xffe < uVar38) {
            uVar38 = 0xfff;
          }
          pBVar45 = (ms->window).base;
          uVar41 = iVar13 - (int)pBVar45;
          local_100 = (U32 *)(ulong)uVar41;
          local_a0 = (ulong)(*puVar23 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU));
          uVar31 = 0;
          local_118 = ms->chainTable;
          uVar8 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar13 = uVar41 - uVar8;
          if (uVar41 < uVar8) {
            iVar13 = 0;
          }
          local_d8 = (uint *)CONCAT44(local_d8._4_4_,iVar13);
          UVar10 = (ms->window).lowLimit;
          uVar39 = UVar10 + (UVar10 == 0);
          local_d0 = (uint *)CONCAT44(local_d0._4_4_,uVar8);
          uVar33 = (ulong)((uVar8 & uVar41) * 2);
          local_140 = local_118 + uVar33;
          local_180 = local_118 + uVar33 + 1;
          UVar10 = (ms->window).dictLimit;
          iVar13 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_90 = ms->hashTable;
          local_108 = (uint *)(ulong)local_90[local_a0];
          iVar17 = uVar41 + 9;
          uVar33 = uVar37 + 3;
          local_e0 = (uint *)((long)puVar23 + 3);
          local_f8 = (U32 *)CONCAT44(local_f8._4_4_,uVar38);
          for (; uVar37 < uVar33; uVar37 = uVar37 + 1) {
            if (uVar37 == 3) {
              uVar8 = pZVar3->rep[0] - 1;
            }
            else {
              uVar8 = pUVar32[uVar43 * 7 + uVar37];
            }
            uVar36 = 0;
            if ((uVar8 - 1 < uVar41 - UVar10) &&
               (uVar36 = 0, ((*(uint *)((long)puVar23 - (ulong)uVar8) ^ *puVar23) & 0xffffff) == 0))
            {
              sVar18 = ZSTD_count((BYTE *)local_e0,(BYTE *)((long)local_e0 - (ulong)uVar8),pBVar2);
              uVar36 = (int)sVar18 + 3;
              uVar38 = (uint)local_f8;
            }
            uVar30 = (ulong)uVar36;
            if (local_1a8 < uVar30) {
              pZVar4[uVar31].off = (int)uVar37 - (uint)(UVar14 != 0);
              pZVar4[uVar31].len = uVar36;
              uVar31 = (ulong)((int)uVar31 + 1);
              if ((uVar38 < uVar36) ||
                 (local_1a8 = (U32 *)uVar30, (BYTE *)((long)puVar23 + uVar30) == pBVar2))
              goto LAB_003cde81;
            }
          }
          if ((((2 < local_1a8) ||
               (UVar10 = ZSTD_insertAndFindFirstIndexHash3(ms,(BYTE *)puVar23), UVar10 < uVar39)) ||
              (uVar38 = (int)local_100 - UVar10, 0x3ffff < uVar38)) ||
             (sVar18 = ZSTD_count((BYTE *)puVar23,pBVar45 + UVar10,pBVar2), sVar18 < 3)) {
LAB_003cdc94:
            local_90[local_a0] = (U32)local_100;
            local_100 = (U32 *)(ulong)((U32)local_100 + 2);
            uVar43 = 0;
            uVar37 = 0;
            puVar19 = local_108;
            do {
              bVar46 = iVar13 == 0;
              iVar13 = iVar13 + -1;
              local_190 = local_180;
              if ((bVar46) || (uVar38 = (uint)puVar19, uVar38 < uVar39)) goto LAB_003cde70;
              uVar33 = uVar43;
              if (uVar37 < uVar43) {
                uVar33 = uVar37;
              }
              sVar18 = ZSTD_count((BYTE *)((long)puVar23 + uVar33),
                                  pBVar45 + uVar33 + ((ulong)puVar19 & 0xffffffff),pBVar2);
              uVar33 = sVar18 + uVar33;
              if (local_1a8 < uVar33) {
                iVar12 = uVar38 + (U32)uVar33;
                if (uVar33 <= iVar17 - uVar38) {
                  iVar12 = iVar17;
                }
                iVar17 = iVar12;
                pZVar4[uVar31].off = (int)local_100 - uVar38;
                pZVar4[uVar31].len = (U32)uVar33;
                uVar31 = (ulong)((int)uVar31 + 1);
                if ((0x1000 < uVar33) ||
                   (local_1a8 = (U32 *)uVar33, (BYTE *)((long)puVar23 + uVar33) == pBVar2))
                goto LAB_003cde70;
              }
              puVar34 = local_118 + (uVar38 & (uint)local_d0) * 2;
              if (pBVar45[uVar33 + ((ulong)puVar19 & 0xffffffff)] <
                  *(byte *)((long)puVar23 + uVar33)) {
                *local_140 = uVar38;
                if (uVar38 <= (uint)local_d8) {
                  local_140 = (uint *)&local_f0;
                  goto LAB_003cde70;
                }
                puVar34 = puVar34 + 1;
                uVar37 = uVar33;
                local_140 = puVar34;
              }
              else {
                *local_180 = uVar38;
                local_180 = puVar34;
                uVar43 = uVar33;
                if (uVar38 <= (uint)local_d8) {
                  local_190 = (uint *)&local_f0;
                  goto LAB_003cde70;
                }
              }
              puVar19 = (uint *)(ulong)*puVar34;
            } while( true );
          }
          pZVar4->off = uVar38 + 2;
          pZVar4->len = (U32)sVar18;
          uVar31 = 1;
          local_1a8 = (U32 *)sVar18;
          if (sVar18 <= ((ulong)local_f8 & 0xffffffff) && (BYTE *)(sVar18 + (long)puVar23) != pBVar2
             ) goto LAB_003cdc94;
          UVar10 = (int)local_100 + 1;
          uVar31 = 1;
          goto LAB_003cde79;
        }
      }
      uVar29 = uVar29 & 0xffffffff;
      iVar11 = pZVar5[uVar29].price;
      UVar9 = pZVar5[uVar29].off;
      uVar38 = pZVar5[uVar29].mlen;
      local_160._0_4_ = pZVar5[uVar29].litlen;
      local_58 = pZVar5[uVar29].rep[2];
      local_60 = *(undefined8 *)pZVar5[uVar29].rep;
      uVar35 = uVar8 - ((U32)local_160 + uVar38);
      if (uVar8 < (U32)local_160 + uVar38) {
        uVar35 = 0;
      }
      uVar29 = (ulong)uVar35;
    }
LAB_003ce0d3:
    local_98 = (uint *)CONCAT44(local_98._4_4_,iVar11);
    uVar8 = (int)uVar29 + 1;
    pZVar5[uVar8].price = iVar11;
    pZVar5[uVar8].off = UVar9;
    pZVar5[uVar8].mlen = uVar38;
    pZVar5[uVar8].litlen = (U32)local_160;
    *(undefined8 *)pZVar5[uVar8].rep = local_60;
    pZVar5[uVar8].rep[2] = local_58;
    uVar43 = uVar29;
    while (uVar38 = (uint)uVar29, src = local_b8, uVar38 != 0) {
      uVar35 = pZVar5[uVar29].litlen + pZVar5[uVar29].mlen;
      pZVar22 = pZVar5 + uVar29;
      iVar11 = pZVar22->price;
      UVar9 = pZVar22->off;
      UVar10 = pZVar22->mlen;
      UVar15 = pZVar22->litlen;
      pZVar22 = pZVar5 + uVar29;
      UVar14 = pZVar22->rep[0];
      uVar6 = *(undefined8 *)(&pZVar22->litlen + 2);
      pZVar3 = pZVar5 + uVar43;
      pZVar3->litlen = pZVar22->litlen;
      pZVar3->rep[0] = UVar14;
      *(undefined8 *)(&pZVar3->litlen + 2) = uVar6;
      pZVar22 = pZVar5 + uVar43;
      pZVar22->price = iVar11;
      pZVar22->off = UVar9;
      pZVar22->mlen = UVar10;
      pZVar22->litlen = UVar15;
      uVar29 = (ulong)(uVar38 - uVar35);
      if (uVar38 < uVar35) {
        uVar29 = 0;
      }
      uVar43 = (ulong)((int)uVar43 - 1);
    }
    while (uVar38 = (int)uVar43 + 1, uVar43 = (ulong)uVar38, uVar38 <= uVar8) {
      uVar38 = pZVar5[uVar43].litlen;
      uVar29 = (ulong)uVar38;
      UVar14 = pZVar5[uVar43].mlen;
      if (UVar14 == 0) {
        puVar44 = (uint *)(uVar29 + (long)src);
      }
      else {
        uVar35 = pZVar5[uVar43].off;
        if (uVar35 < 3) {
          uVar41 = (uVar29 == 0) + uVar35;
          if (uVar41 != 0) {
            if (uVar41 == 3) {
              UVar9 = *local_a8 - 1;
LAB_003ce1c0:
              local_a8[2] = local_a8[1];
            }
            else {
              UVar9 = local_a8[uVar41];
              if (uVar41 != 1) goto LAB_003ce1c0;
            }
            local_a8[1] = *local_a8;
            goto LAB_003ce1cb;
          }
        }
        else {
          *(undefined8 *)(local_a8 + 1) = *(undefined8 *)local_a8;
          UVar9 = uVar35 - 2;
LAB_003ce1cb:
          *local_a8 = UVar9;
        }
        ZSTD_updateStats(local_c0,uVar38,(BYTE *)src,uVar35,UVar14);
        ZSTD_storeSeq(local_48,uVar29,src,uVar35,(ulong)(UVar14 - 3));
        src = (void *)((long)src + (ulong)(UVar14 + uVar38));
        puVar44 = (uint *)src;
      }
    }
    ZSTD_setBasePrices(local_c0,2);
    local_b8 = (uint *)src;
  }
  goto LAB_003cba83;
LAB_003cdc54:
  local_190 = (uint *)&local_f0;
  local_140 = local_178;
  goto LAB_003cde70;
LAB_003cdc40:
  local_140 = (uint *)&local_f0;
LAB_003cde70:
  *local_190 = 0;
  *local_140 = 0;
  UVar10 = iVar17 - 8;
LAB_003cde79:
  ms->nextToUpdate = UVar10;
LAB_003cde81:
  if ((int)uVar31 != 0) {
    uVar8 = (int)uVar31 - 1;
    uVar38 = pZVar4[uVar8].len;
    if (((uint)local_50 < uVar38) || (0xfff < uVar38 + uVar35)) {
      UVar14 = 0;
      if (pZVar3->mlen == 0) {
        UVar14 = pZVar3->litlen;
      }
      UVar9 = pZVar4[uVar8].off;
      uVar8 = uVar35 - UVar14;
      if (0x1000 < uVar35 - UVar14) {
        uVar8 = 0;
      }
      uVar29 = (ulong)uVar8;
      iVar11 = (int)local_98;
      goto LAB_003ce0d3;
    }
    pUVar32 = (U32 *)((long)pZVar5->rep + local_c8);
    for (uVar43 = 0; uVar43 != uVar31; uVar43 = uVar43 + 1) {
      UVar10 = pZVar4[uVar43].off;
      rVar47 = ZSTD_updateRep(pUVar32,UVar10,(uint)(UVar14 != 0));
      uVar38 = (uint)local_40;
      if (uVar43 != 0) {
        uVar38 = pZVar4[uVar43 - 1].len + 1;
      }
      UVar15 = pZVar4[uVar43].len;
      uVar8 = 0x1f;
      if (UVar10 + 1 != 0) {
        for (; UVar10 + 1 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      for (; uVar38 <= UVar15; UVar15 = UVar15 - 1) {
        if ((ms->opt).priceType == zop_predef) {
          uVar41 = UVar15 - 2;
          iVar13 = 0x1f;
          if (uVar41 != 0) {
            for (; uVar41 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          iVar13 = (iVar13 + uVar8) * 0x100 + (uVar41 * 0x100 >> ((byte)iVar13 & 0x1f)) + 0x1000;
        }
        else {
          uVar39 = UVar15 - 3;
          uVar41 = (ms->opt).offCodeFreq[uVar8] + 1;
          iVar13 = 0x1f;
          if (uVar41 != 0) {
            for (; uVar41 >> iVar13 == 0; iVar13 = iVar13 + -1) {
            }
          }
          if (uVar39 < 0x80) {
            uVar39 = (uint)(byte)(&ZSTD_MLcode_ML_Code)[uVar39];
          }
          else {
            uVar36 = 0x1f;
            if (uVar39 != 0) {
              for (; uVar39 >> uVar36 == 0; uVar36 = uVar36 - 1) {
              }
            }
            uVar39 = (uVar36 ^ 0xffffffe0) + 0x44;
          }
          uVar36 = (ms->opt).matchLengthFreq[uVar39] + 1;
          iVar12 = 0x1f;
          if (uVar36 != 0) {
            for (; uVar36 >> iVar12 == 0; iVar12 = iVar12 + -1) {
            }
          }
          iVar13 = ((ML_bits[uVar39] + uVar8) - (iVar13 + iVar12)) * 0x100 +
                   (((ms->opt).offCodeSumBasePrice + (ms->opt).matchLengthSumBasePrice) -
                   ((uVar41 * 0x100 >> ((byte)iVar13 & 0x1f)) +
                   (uVar36 * 0x100 >> ((byte)iVar12 & 0x1f)))) + 0x33;
        }
        iVar13 = iVar13 + UVar9 + iVar11;
        uVar37 = (ulong)(UVar15 + uVar35);
        if (((uint)uVar29 < UVar15 + uVar35) || (iVar13 < pZVar5[uVar37].price)) {
          uVar29 = uVar29 & 0xffffffff;
          pZVar22 = local_70 + uVar29;
          for (; uVar29 < uVar37; uVar29 = uVar29 + 1) {
            pZVar22->price = 0x40000000;
            pZVar22 = pZVar22 + 1;
          }
          pZVar5[uVar37].mlen = UVar15;
          pZVar5[uVar37].off = UVar10;
          pZVar5[uVar37].litlen = (U32)local_160;
          pZVar5[uVar37].price = iVar13;
          *(long *)pZVar5[uVar37].rep = rVar47.rep._0_8_;
          pZVar5[uVar37].rep[2] = rVar47.rep[2];
        }
      }
    }
  }
LAB_003ce086:
  uVar43 = (ulong)(uVar35 + 1);
  goto LAB_003ccc94;
}

Assistant:

size_t ZSTD_compressBlock_btultra2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        const void* src, size_t srcSize)
{
    U32 const current = (U32)((const BYTE*)src - ms->window.base);
    DEBUGLOG(5, "ZSTD_compressBlock_btultra2 (srcSize=%zu)", srcSize);

    /* 2-pass strategy:
     * this strategy makes a first pass over first block to collect statistics
     * and seed next round's statistics with it.
     * After 1st pass, function forgets everything, and starts a new block.
     * Consequently, this can only work if no data has been previously loaded in tables,
     * aka, no dictionary, no prefix, no ldm preprocessing.
     * The compression ratio gain is generally small (~0.5% on first block),
     * the cost is 2x cpu time on first block. */
    assert(srcSize <= ZSTD_BLOCKSIZE_MAX);
    if ( (ms->opt.litLengthSum==0)   /* first block */
      && (seqStore->sequences == seqStore->sequencesStart)  /* no ldm */
      && (ms->window.dictLimit == ms->window.lowLimit)   /* no dictionary */
      && (current == ms->window.dictLimit)   /* start of frame, nothing already loaded nor skipped */
      && (srcSize > ZSTD_PREDEF_THRESHOLD)
      ) {
        ZSTD_initStats_ultra(ms, seqStore, rep, src, srcSize);
    }

    return ZSTD_compressBlock_opt_generic(ms, seqStore, rep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);
}